

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMiIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  uint uVar1;
  uint uVar2;
  float *pfVar3;
  Geometry *pGVar4;
  RTCRayQueryContext *pRVar5;
  RTCFilterFunctionN p_Var6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  size_t k;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [28];
  int iVar72;
  long lVar73;
  undefined1 (*pauVar74) [32];
  ulong uVar75;
  ulong uVar76;
  ulong *puVar77;
  NodeRef root;
  undefined4 uVar78;
  ulong unaff_R15;
  ulong uVar79;
  bool bVar80;
  float fVar81;
  float fVar89;
  float fVar91;
  float fVar93;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  float fVar90;
  float fVar92;
  float fVar94;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 extraout_var [56];
  float fVar115;
  float fVar116;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar126;
  float fVar128;
  float fVar130;
  float fVar132;
  float fVar134;
  float fVar136;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar125;
  float fVar127;
  float fVar129;
  float fVar131;
  float fVar133;
  float fVar135;
  undefined1 in_ZMM2 [64];
  undefined1 auVar124 [64];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [64];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [64];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [32];
  undefined1 auVar164 [32];
  undefined1 auVar163 [32];
  undefined1 auVar166 [64];
  undefined1 auVar167 [32];
  undefined1 auVar169 [32];
  undefined1 auVar168 [32];
  undefined1 auVar170 [64];
  float fVar171;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  undefined1 auVar172 [64];
  undefined1 auVar179 [32];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vbool<8> terminated;
  TravRayK<8,_true> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_5fc1;
  ulong local_5fc0;
  ulong local_5fb8;
  RayK<8> *local_5fb0;
  RayQueryContext *local_5fa8;
  undefined1 local_5fa0 [8];
  float fStack_5f98;
  float fStack_5f94;
  float fStack_5f90;
  float fStack_5f8c;
  float fStack_5f88;
  RayK<8> *local_5f68;
  undefined1 local_5f60 [40];
  undefined1 (*local_5f38) [32];
  RTCFilterFunctionNArguments local_5f30;
  undefined1 local_5f00 [32];
  BVH *local_5ee0;
  Intersectors *local_5ed8;
  ulong local_5ed0;
  Scene *local_5ec8;
  undefined1 local_5ec0 [32];
  undefined1 local_5ea0 [32];
  undefined1 local_5e80 [32];
  undefined1 local_5e60 [32];
  undefined1 local_5e40 [32];
  undefined1 local_5e20 [32];
  undefined1 local_5e00 [32];
  undefined1 local_5de0 [32];
  undefined1 local_5dc0 [32];
  undefined1 local_5da0 [32];
  undefined1 local_5d80 [32];
  undefined1 local_5d60 [32];
  undefined1 local_5d40 [32];
  undefined1 local_5d20 [32];
  undefined1 local_5d00 [32];
  undefined1 local_5ce0 [32];
  undefined1 local_5cc0 [32];
  RTCHitN local_5ca0 [32];
  undefined1 local_5c80 [32];
  undefined1 local_5c60 [32];
  undefined1 local_5c40 [32];
  undefined1 local_5c20 [32];
  undefined1 local_5c00 [32];
  uint local_5be0;
  uint uStack_5bdc;
  uint uStack_5bd8;
  uint uStack_5bd4;
  uint uStack_5bd0;
  uint uStack_5bcc;
  uint uStack_5bc8;
  uint uStack_5bc4;
  uint local_5bc0;
  uint uStack_5bbc;
  uint uStack_5bb8;
  uint uStack_5bb4;
  uint uStack_5bb0;
  uint uStack_5bac;
  uint uStack_5ba8;
  uint uStack_5ba4;
  uint local_5ba0;
  uint uStack_5b9c;
  uint uStack_5b98;
  uint uStack_5b94;
  uint uStack_5b90;
  uint uStack_5b8c;
  uint uStack_5b88;
  uint uStack_5b84;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5b80;
  undefined1 local_5b20 [32];
  undefined1 local_5b00 [32];
  undefined1 local_5ae0 [32];
  undefined1 local_5ac0 [8];
  float fStack_5ab8;
  float fStack_5ab4;
  float fStack_5ab0;
  float fStack_5aac;
  float fStack_5aa8;
  undefined1 local_5aa0 [8];
  float fStack_5a98;
  float fStack_5a94;
  float fStack_5a90;
  float fStack_5a8c;
  float fStack_5a88;
  undefined1 local_5a80 [32];
  undefined1 local_5a60 [32];
  undefined1 local_5a40 [32];
  undefined1 local_5a20 [32];
  undefined1 local_5a00 [32];
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined8 local_59a0;
  undefined8 uStack_5998;
  undefined8 uStack_5990;
  undefined8 uStack_5988;
  undefined8 local_5980;
  undefined8 uStack_5978;
  undefined8 uStack_5970;
  undefined8 uStack_5968;
  undefined1 local_5960 [32];
  undefined1 local_5940 [32];
  float local_5920;
  float fStack_591c;
  float fStack_5918;
  float fStack_5914;
  float fStack_5910;
  float fStack_590c;
  float fStack_5908;
  float fStack_5904;
  float local_5900;
  float fStack_58fc;
  float fStack_58f8;
  float fStack_58f4;
  float fStack_58f0;
  float fStack_58ec;
  float fStack_58e8;
  float fStack_58e4;
  float local_58e0;
  float fStack_58dc;
  float fStack_58d8;
  float fStack_58d4;
  float fStack_58d0;
  float fStack_58cc;
  float fStack_58c8;
  float fStack_58c4;
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  undefined1 local_5860 [32];
  undefined1 local_5840 [32];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  undefined1 auVar165 [64];
  
  local_5ee0 = (BVH *)This->ptr;
  local_5808 = (local_5ee0->root).ptr;
  if (local_5808 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar110 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar95 = ZEXT816(0) << 0x40;
      auVar106 = vpcmpeqd_avx2(auVar110,(undefined1  [32])valid_i->field_0);
      auVar110 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar95),5);
      auVar96 = auVar106 & auVar110;
      if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar96 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar96 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar96 >> 0x7f,0) != '\0') ||
            (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar96 >> 0xbf,0) != '\0') ||
          (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar96[0x1f] < '\0') {
        auVar110 = vandps_avx(auVar110,auVar106);
        auVar14 = vpackssdw_avx(auVar110._0_16_,auVar110._16_16_);
        auVar124 = ZEXT1664(auVar14);
        local_5b80._0_8_ = *(undefined8 *)ray;
        local_5b80._8_8_ = *(undefined8 *)(ray + 8);
        local_5b80._16_8_ = *(undefined8 *)(ray + 0x10);
        local_5b80._24_8_ = *(undefined8 *)(ray + 0x18);
        local_5b80._32_8_ = *(undefined8 *)(ray + 0x20);
        local_5b80._40_8_ = *(undefined8 *)(ray + 0x28);
        local_5b80._48_8_ = *(undefined8 *)(ray + 0x30);
        local_5b80._56_8_ = *(undefined8 *)(ray + 0x38);
        local_5b80._64_8_ = *(undefined8 *)(ray + 0x40);
        local_5b80._72_8_ = *(undefined8 *)(ray + 0x48);
        local_5b80._80_8_ = *(undefined8 *)(ray + 0x50);
        local_5b80._88_8_ = *(undefined8 *)(ray + 0x58);
        local_5b20 = *(undefined1 (*) [32])(ray + 0x80);
        local_5b00 = *(undefined1 (*) [32])(ray + 0xa0);
        local_5cc0._8_4_ = 0x7fffffff;
        local_5cc0._0_8_ = 0x7fffffff7fffffff;
        local_5cc0._12_4_ = 0x7fffffff;
        local_5cc0._16_4_ = 0x7fffffff;
        local_5cc0._20_4_ = 0x7fffffff;
        local_5cc0._24_4_ = 0x7fffffff;
        local_5cc0._28_4_ = 0x7fffffff;
        auVar163._8_4_ = 0x219392ef;
        auVar163._0_8_ = 0x219392ef219392ef;
        auVar163._12_4_ = 0x219392ef;
        auVar163._16_4_ = 0x219392ef;
        auVar163._20_4_ = 0x219392ef;
        auVar163._24_4_ = 0x219392ef;
        auVar163._28_4_ = 0x219392ef;
        auVar165 = ZEXT3264(auVar163);
        auVar168._8_4_ = 0x3f800000;
        auVar168._0_8_ = 0x3f8000003f800000;
        auVar168._12_4_ = 0x3f800000;
        auVar168._16_4_ = 0x3f800000;
        auVar168._20_4_ = 0x3f800000;
        auVar168._24_4_ = 0x3f800000;
        auVar168._28_4_ = 0x3f800000;
        local_5ae0 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar144 = vdivps_avx(auVar168,local_5b20);
        auVar110 = vandps_avx(local_5cc0,local_5b20);
        auVar96 = vcmpps_avx(auVar110,auVar163,1);
        auVar110 = vandps_avx(local_5cc0,local_5b00);
        auVar106 = vcmpps_avx(auVar110,auVar163,1);
        auVar146 = vdivps_avx(auVar168,local_5b00);
        auVar110 = vandps_avx(local_5cc0,local_5ae0);
        auVar107._8_4_ = 0x5d5e0b6b;
        auVar107._0_8_ = 0x5d5e0b6b5d5e0b6b;
        auVar107._12_4_ = 0x5d5e0b6b;
        auVar107._16_4_ = 0x5d5e0b6b;
        auVar107._20_4_ = 0x5d5e0b6b;
        auVar107._24_4_ = 0x5d5e0b6b;
        auVar107._28_4_ = 0x5d5e0b6b;
        _local_5ac0 = vblendvps_avx(auVar144,auVar107,auVar96);
        auVar110 = vcmpps_avx(auVar110,auVar163,1);
        auVar96 = vdivps_avx(auVar168,local_5ae0);
        auVar160 = ZEXT3264(auVar96);
        _local_5aa0 = vblendvps_avx(auVar146,auVar107,auVar106);
        local_5a80 = vblendvps_avx(auVar96,auVar107,auVar110);
        auVar152 = ZEXT3264(local_5a80);
        auVar110 = vcmpps_avx(_local_5ac0,ZEXT1632(auVar95),1);
        auVar146._8_4_ = 0x20;
        auVar146._0_8_ = 0x2000000020;
        auVar146._12_4_ = 0x20;
        auVar146._16_4_ = 0x20;
        auVar146._20_4_ = 0x20;
        auVar146._24_4_ = 0x20;
        auVar146._28_4_ = 0x20;
        local_5a60 = vandps_avx(auVar110,auVar146);
        auVar96 = ZEXT1632(auVar95);
        auVar110 = vcmpps_avx(_local_5aa0,auVar96,5);
        auVar106._8_4_ = 0x40;
        auVar106._0_8_ = 0x4000000040;
        auVar106._12_4_ = 0x40;
        auVar106._16_4_ = 0x40;
        auVar106._20_4_ = 0x40;
        auVar106._24_4_ = 0x40;
        auVar106._28_4_ = 0x40;
        auVar147._8_4_ = 0x60;
        auVar147._0_8_ = 0x6000000060;
        auVar147._12_4_ = 0x60;
        auVar147._16_4_ = 0x60;
        auVar147._20_4_ = 0x60;
        auVar147._24_4_ = 0x60;
        auVar147._28_4_ = 0x60;
        local_5a40 = vblendvps_avx(auVar147,auVar106,auVar110);
        auVar110 = vcmpps_avx(local_5a80,auVar96,5);
        auVar144._8_4_ = 0x80;
        auVar144._0_8_ = 0x8000000080;
        auVar144._12_4_ = 0x80;
        auVar144._16_4_ = 0x80;
        auVar144._20_4_ = 0x80;
        auVar144._24_4_ = 0x80;
        auVar144._28_4_ = 0x80;
        auVar111._8_4_ = 0xa0;
        auVar111._0_8_ = 0xa0000000a0;
        auVar111._12_4_ = 0xa0;
        auVar111._16_4_ = 0xa0;
        auVar111._20_4_ = 0xa0;
        auVar111._24_4_ = 0xa0;
        auVar111._28_4_ = 0xa0;
        local_5a20 = vblendvps_avx(auVar111,auVar144,auVar110);
        auVar110 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar96);
        local_59c0 = vpmovsxwd_avx2(auVar14);
        local_4680._8_4_ = 0x7f800000;
        local_4680._0_8_ = 0x7f8000007f800000;
        local_4680._12_4_ = 0x7f800000;
        local_4680._16_4_ = 0x7f800000;
        local_4680._20_4_ = 0x7f800000;
        local_4680._24_4_ = 0x7f800000;
        local_4680._28_4_ = 0x7f800000;
        auVar170 = ZEXT3264(local_4680);
        local_5a00 = vblendvps_avx(local_4680,auVar110,local_59c0);
        auVar110 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar96);
        auVar96._8_4_ = 0xff800000;
        auVar96._0_8_ = 0xff800000ff800000;
        auVar96._12_4_ = 0xff800000;
        auVar96._16_4_ = 0xff800000;
        auVar96._20_4_ = 0xff800000;
        auVar96._24_4_ = 0xff800000;
        auVar96._28_4_ = 0xff800000;
        local_59e0 = vblendvps_avx(auVar96,auVar110,local_59c0);
        auVar95 = vpcmpeqd_avx(local_59e0._0_16_,local_59e0._0_16_);
        local_5ea0 = vpmovsxwd_avx2(auVar14 ^ auVar95);
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar76 = 7;
        }
        else {
          uVar76 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_5f68 = ray + 0x100;
        puVar77 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar74 = (undefined1 (*) [32])local_4640;
        local_4660 = local_5a00;
        local_5980 = mm_lookupmask_ps._16_8_;
        uStack_5978 = mm_lookupmask_ps._24_8_;
        uStack_5970 = mm_lookupmask_ps._16_8_;
        uStack_5968 = mm_lookupmask_ps._24_8_;
        local_5f38 = (undefined1 (*) [32])&local_5bc0;
        local_59a0 = mm_lookupmask_pd._0_8_;
        uStack_5998 = mm_lookupmask_pd._8_8_;
        uStack_5990 = mm_lookupmask_pd._0_8_;
        uStack_5988 = mm_lookupmask_pd._8_8_;
        auVar172 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                      CONCAT424(0x3f7ffffa,
                                                CONCAT420(0x3f7ffffa,
                                                          CONCAT416(0x3f7ffffa,
                                                                    CONCAT412(0x3f7ffffa,
                                                                              CONCAT48(0x3f7ffffa,
                                                                                                                                                                              
                                                  0x3f7ffffa3f7ffffa)))))));
        local_5fb8 = uVar76;
        local_5fb0 = ray;
        local_5fa8 = context;
        local_5ed8 = This;
LAB_00608c3e:
        do {
          do {
            root.ptr = puVar77[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_00609f1c;
            puVar77 = puVar77 + -1;
            pauVar74 = pauVar74 + -1;
            _local_5fa0 = *pauVar74;
            auVar143 = ZEXT3264(_local_5fa0);
            auVar110 = vcmpps_avx(_local_5fa0,local_59e0,1);
          } while ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                        (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      SUB321(auVar110 >> 0x7f,0) == '\0') &&
                     (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    SUB321(auVar110 >> 0xbf,0) == '\0') &&
                   (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   -1 < auVar110[0x1f]);
          uVar78 = vmovmskps_avx(auVar110);
          unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar78);
          if (uVar76 < (uint)POPCOUNT(uVar78)) {
LAB_00608c7c:
            do {
              iVar72 = 4;
              uVar75 = 8;
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_00609f1c;
                auVar110 = vcmpps_avx(local_59e0,auVar143._0_32_,6);
                if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar110 >> 0x7f,0) == '\0') &&
                      (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar110 >> 0xbf,0) == '\0') &&
                    (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar110[0x1f]) goto LAB_00608c3e;
                local_5ed0 = (ulong)((uint)root.ptr & 0xf) - 8;
                if (local_5ed0 != 0) {
                  auVar103._0_8_ = local_5ea0._0_8_ ^ 0xffffffffffffffff;
                  auVar103._8_4_ = local_5ea0._8_4_ ^ 0xffffffff;
                  auVar103._12_4_ = local_5ea0._12_4_ ^ 0xffffffff;
                  auVar103._16_4_ = local_5ea0._16_4_ ^ 0xffffffff;
                  auVar103._20_4_ = local_5ea0._20_4_ ^ 0xffffffff;
                  auVar103._24_4_ = local_5ea0._24_4_ ^ 0xffffffff;
                  auVar103._28_4_ = local_5ea0._28_4_ ^ 0xffffffff;
                  lVar73 = (root.ptr & 0xfffffffffffffff0) + 0x50;
                  uVar75 = 0;
                  goto LAB_00608e6f;
                }
                auVar110 = vpcmpeqd_avx2(auVar124._0_32_,auVar124._0_32_);
                auVar88 = local_5ea0;
                goto LAB_00609df5;
              }
              lVar73 = 0;
              auVar110 = auVar170._0_32_;
              do {
                uVar79 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar73 * 8);
                if (uVar79 == 8) {
                  auVar143 = ZEXT3264(auVar110);
                  break;
                }
                uVar78 = *(undefined4 *)(root.ptr + 0x40 + lVar73 * 4);
                auVar97._4_4_ = uVar78;
                auVar97._0_4_ = uVar78;
                auVar97._8_4_ = uVar78;
                auVar97._12_4_ = uVar78;
                auVar97._16_4_ = uVar78;
                auVar97._20_4_ = uVar78;
                auVar97._24_4_ = uVar78;
                auVar97._28_4_ = uVar78;
                auVar63._8_8_ = local_5b80._8_8_;
                auVar63._0_8_ = local_5b80._0_8_;
                auVar63._16_8_ = local_5b80._16_8_;
                auVar63._24_8_ = local_5b80._24_8_;
                auVar64._8_8_ = local_5b80._40_8_;
                auVar64._0_8_ = local_5b80._32_8_;
                auVar64._16_8_ = local_5b80._48_8_;
                auVar64._24_8_ = local_5b80._56_8_;
                auVar65._8_8_ = local_5b80._72_8_;
                auVar65._0_8_ = local_5b80._64_8_;
                auVar65._16_8_ = local_5b80._80_8_;
                auVar65._24_8_ = local_5b80._88_8_;
                auVar96 = vsubps_avx(auVar97,auVar63);
                auVar143._0_4_ = (float)local_5ac0._0_4_ * auVar96._0_4_;
                auVar143._4_4_ = (float)local_5ac0._4_4_ * auVar96._4_4_;
                auVar143._8_4_ = fStack_5ab8 * auVar96._8_4_;
                auVar143._12_4_ = fStack_5ab4 * auVar96._12_4_;
                auVar143._16_4_ = fStack_5ab0 * auVar96._16_4_;
                auVar143._20_4_ = fStack_5aac * auVar96._20_4_;
                auVar143._28_36_ = auVar152._28_36_;
                auVar143._24_4_ = fStack_5aa8 * auVar96._24_4_;
                auVar144 = auVar143._0_32_;
                auVar152 = ZEXT3264(auVar144);
                uVar78 = *(undefined4 *)(root.ptr + 0x80 + lVar73 * 4);
                auVar98._4_4_ = uVar78;
                auVar98._0_4_ = uVar78;
                auVar98._8_4_ = uVar78;
                auVar98._12_4_ = uVar78;
                auVar98._16_4_ = uVar78;
                auVar98._20_4_ = uVar78;
                auVar98._24_4_ = uVar78;
                auVar98._28_4_ = uVar78;
                auVar96 = vsubps_avx(auVar98,auVar64);
                auVar161._0_4_ = (float)local_5aa0._0_4_ * auVar96._0_4_;
                auVar161._4_4_ = (float)local_5aa0._4_4_ * auVar96._4_4_;
                auVar161._8_4_ = fStack_5a98 * auVar96._8_4_;
                auVar161._12_4_ = fStack_5a94 * auVar96._12_4_;
                auVar161._16_4_ = fStack_5a90 * auVar96._16_4_;
                auVar161._20_4_ = fStack_5a8c * auVar96._20_4_;
                auVar161._28_36_ = auVar160._28_36_;
                auVar161._24_4_ = fStack_5a88 * auVar96._24_4_;
                auVar146 = auVar161._0_32_;
                auVar160 = ZEXT3264(auVar146);
                uVar78 = *(undefined4 *)(root.ptr + 0xc0 + lVar73 * 4);
                auVar99._4_4_ = uVar78;
                auVar99._0_4_ = uVar78;
                auVar99._8_4_ = uVar78;
                auVar99._12_4_ = uVar78;
                auVar99._16_4_ = uVar78;
                auVar99._20_4_ = uVar78;
                auVar99._24_4_ = uVar78;
                auVar99._28_4_ = uVar78;
                auVar96 = vsubps_avx(auVar99,auVar65);
                auVar166._0_4_ = local_5a80._0_4_ * auVar96._0_4_;
                auVar166._4_4_ = local_5a80._4_4_ * auVar96._4_4_;
                auVar166._8_4_ = local_5a80._8_4_ * auVar96._8_4_;
                auVar166._12_4_ = local_5a80._12_4_ * auVar96._12_4_;
                auVar166._16_4_ = local_5a80._16_4_ * auVar96._16_4_;
                auVar166._20_4_ = local_5a80._20_4_ * auVar96._20_4_;
                auVar166._28_36_ = auVar165._28_36_;
                auVar166._24_4_ = local_5a80._24_4_ * auVar96._24_4_;
                auVar147 = auVar166._0_32_;
                auVar165 = ZEXT3264(auVar147);
                uVar78 = *(undefined4 *)(root.ptr + 0x60 + lVar73 * 4);
                auVar100._4_4_ = uVar78;
                auVar100._0_4_ = uVar78;
                auVar100._8_4_ = uVar78;
                auVar100._12_4_ = uVar78;
                auVar100._16_4_ = uVar78;
                auVar100._20_4_ = uVar78;
                auVar100._24_4_ = uVar78;
                auVar100._28_4_ = uVar78;
                auVar96 = vsubps_avx(auVar100,auVar63);
                auVar17._4_4_ = (float)local_5ac0._4_4_ * auVar96._4_4_;
                auVar17._0_4_ = (float)local_5ac0._0_4_ * auVar96._0_4_;
                auVar17._8_4_ = fStack_5ab8 * auVar96._8_4_;
                auVar17._12_4_ = fStack_5ab4 * auVar96._12_4_;
                auVar17._16_4_ = fStack_5ab0 * auVar96._16_4_;
                auVar17._20_4_ = fStack_5aac * auVar96._20_4_;
                auVar17._24_4_ = fStack_5aa8 * auVar96._24_4_;
                auVar17._28_4_ = (int)((ulong)local_5b80._24_8_ >> 0x20);
                uVar78 = *(undefined4 *)(root.ptr + 0xa0 + lVar73 * 4);
                auVar101._4_4_ = uVar78;
                auVar101._0_4_ = uVar78;
                auVar101._8_4_ = uVar78;
                auVar101._12_4_ = uVar78;
                auVar101._16_4_ = uVar78;
                auVar101._20_4_ = uVar78;
                auVar101._24_4_ = uVar78;
                auVar101._28_4_ = uVar78;
                auVar96 = vsubps_avx(auVar101,auVar64);
                auVar18._4_4_ = (float)local_5aa0._4_4_ * auVar96._4_4_;
                auVar18._0_4_ = (float)local_5aa0._0_4_ * auVar96._0_4_;
                auVar18._8_4_ = fStack_5a98 * auVar96._8_4_;
                auVar18._12_4_ = fStack_5a94 * auVar96._12_4_;
                auVar18._16_4_ = fStack_5a90 * auVar96._16_4_;
                auVar18._20_4_ = fStack_5a8c * auVar96._20_4_;
                auVar18._24_4_ = fStack_5a88 * auVar96._24_4_;
                auVar18._28_4_ = (int)((ulong)local_5b80._56_8_ >> 0x20);
                uVar78 = *(undefined4 *)(root.ptr + 0xe0 + lVar73 * 4);
                auVar102._4_4_ = uVar78;
                auVar102._0_4_ = uVar78;
                auVar102._8_4_ = uVar78;
                auVar102._12_4_ = uVar78;
                auVar102._16_4_ = uVar78;
                auVar102._20_4_ = uVar78;
                auVar102._24_4_ = uVar78;
                auVar102._28_4_ = uVar78;
                auVar96 = vsubps_avx(auVar102,auVar65);
                auVar19._4_4_ = local_5a80._4_4_ * auVar96._4_4_;
                auVar19._0_4_ = local_5a80._0_4_ * auVar96._0_4_;
                auVar19._8_4_ = local_5a80._8_4_ * auVar96._8_4_;
                auVar19._12_4_ = local_5a80._12_4_ * auVar96._12_4_;
                auVar19._16_4_ = local_5a80._16_4_ * auVar96._16_4_;
                auVar19._20_4_ = local_5a80._20_4_ * auVar96._20_4_;
                auVar19._24_4_ = local_5a80._24_4_ * auVar96._24_4_;
                auVar19._28_4_ = (int)((ulong)local_5b80._88_8_ >> 0x20);
                auVar96 = vminps_avx(auVar144,auVar17);
                auVar106 = vminps_avx(auVar146,auVar18);
                auVar96 = vmaxps_avx(auVar96,auVar106);
                auVar106 = vminps_avx(auVar147,auVar19);
                auVar96 = vmaxps_avx(auVar96,auVar106);
                auVar20._4_4_ = auVar172._4_4_ * auVar96._4_4_;
                auVar20._0_4_ = auVar172._0_4_ * auVar96._0_4_;
                auVar20._8_4_ = auVar172._8_4_ * auVar96._8_4_;
                auVar20._12_4_ = auVar172._12_4_ * auVar96._12_4_;
                auVar20._16_4_ = auVar172._16_4_ * auVar96._16_4_;
                auVar20._20_4_ = auVar172._20_4_ * auVar96._20_4_;
                auVar20._24_4_ = auVar172._24_4_ * auVar96._24_4_;
                auVar20._28_4_ = auVar96._28_4_;
                auVar96 = vmaxps_avx(auVar144,auVar17);
                auVar106 = vmaxps_avx(auVar146,auVar18);
                auVar106 = vminps_avx(auVar96,auVar106);
                auVar96 = vmaxps_avx(auVar147,auVar19);
                auVar96 = vminps_avx(auVar106,auVar96);
                auVar21._4_4_ = auVar96._4_4_ * 1.0000004;
                auVar21._0_4_ = auVar96._0_4_ * 1.0000004;
                auVar21._8_4_ = auVar96._8_4_ * 1.0000004;
                auVar21._12_4_ = auVar96._12_4_ * 1.0000004;
                auVar21._16_4_ = auVar96._16_4_ * 1.0000004;
                auVar21._20_4_ = auVar96._20_4_ * 1.0000004;
                auVar21._24_4_ = auVar96._24_4_ * 1.0000004;
                auVar21._28_4_ = auVar96._28_4_;
                auVar96 = vmaxps_avx(auVar20,local_5a00);
                auVar106 = vminps_avx(auVar21,local_59e0);
                auVar96 = vcmpps_avx(auVar96,auVar106,2);
                auVar124 = ZEXT3264(auVar96);
                if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar96 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar96 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar96 >> 0x7f,0) == '\0') &&
                      (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar96 >> 0xbf,0) == '\0') &&
                    (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar96[0x1f]) {
                  auVar143 = ZEXT3264(auVar110);
                  uVar79 = uVar75;
                }
                else {
                  auVar96 = vblendvps_avx(auVar170._0_32_,auVar20,auVar96);
                  auVar143 = ZEXT3264(auVar96);
                  if (uVar75 != 8) {
                    *puVar77 = uVar75;
                    puVar77 = puVar77 + 1;
                    *pauVar74 = auVar110;
                    pauVar74 = pauVar74 + 1;
                  }
                }
                uVar75 = uVar79;
                lVar73 = lVar73 + 1;
                auVar110 = auVar143._0_32_;
              } while (lVar73 != 8);
              if (uVar75 == 8) goto LAB_00608e0b;
              auVar110 = vcmpps_avx(local_59e0,auVar143._0_32_,6);
              uVar78 = vmovmskps_avx(auVar110);
              root.ptr = uVar75;
            } while ((byte)uVar76 < (byte)POPCOUNT(uVar78));
            *puVar77 = uVar75;
            puVar77 = puVar77 + 1;
            *pauVar74 = auVar143._0_32_;
            pauVar74 = pauVar74 + 1;
          }
          else {
            for (; unaff_R15 != 0; unaff_R15 = unaff_R15 - 1 & unaff_R15) {
              k = 0;
              for (uVar76 = unaff_R15; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000)
              {
                k = k + 1;
              }
              local_5f60._0_8_ = k;
              auVar124 = ZEXT1664(auVar124._0_16_);
              auVar152 = ZEXT1664(auVar152._0_16_);
              auVar160 = ZEXT1664(auVar160._0_16_);
              auVar165 = ZEXT1664(auVar165._0_16_);
              bVar80 = occluded1(local_5ed8,local_5ee0,root,k,&local_5fc1,ray,
                                 (TravRayK<8,_true> *)&local_5b80.field_0,context);
              if (bVar80) {
                *(undefined4 *)(local_5ea0 + local_5f60._0_8_ * 4) = 0xffffffff;
              }
              auVar170 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar172 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                            CONCAT424(0x3f7ffffa,
                                                      CONCAT420(0x3f7ffffa,
                                                                CONCAT416(0x3f7ffffa,
                                                                          CONCAT412(0x3f7ffffa,
                                                                                    CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
              auVar143 = ZEXT3264(_local_5fa0);
              uVar76 = local_5fb8;
              ray = local_5fb0;
              context = local_5fa8;
            }
            auVar110 = _DAT_01fe9960 & ~local_5ea0;
            iVar72 = 3;
            if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar110 >> 0x7f,0) != '\0') ||
                  (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar110 >> 0xbf,0) != '\0') ||
                (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar110[0x1f] < '\0') {
              auVar110._8_4_ = 0xff800000;
              auVar110._0_8_ = 0xff800000ff800000;
              auVar110._12_4_ = 0xff800000;
              auVar110._16_4_ = 0xff800000;
              auVar110._20_4_ = 0xff800000;
              auVar110._24_4_ = 0xff800000;
              auVar110._28_4_ = 0xff800000;
              auVar124 = ZEXT3264(auVar110);
              local_59e0 = vblendvps_avx(local_59e0,auVar110,local_5ea0);
              iVar72 = 2;
            }
            unaff_R15 = 0;
            if ((uint)uVar76 < (uint)POPCOUNT(uVar78)) goto LAB_00608c7c;
          }
LAB_00608e0b:
        } while (iVar72 != 3);
LAB_00609f1c:
        auVar110 = vandps_avx(local_59c0,local_5ea0);
        auVar114._8_4_ = 0xff800000;
        auVar114._0_8_ = 0xff800000ff800000;
        auVar114._12_4_ = 0xff800000;
        auVar114._16_4_ = 0xff800000;
        auVar114._20_4_ = 0xff800000;
        auVar114._24_4_ = 0xff800000;
        auVar114._28_4_ = 0xff800000;
        auVar110 = vmaskmovps_avx(auVar110,auVar114);
        *(undefined1 (*) [32])local_5f68 = auVar110;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    uVar75 = local_5fc0 + 1;
    lVar73 = lVar73 + 0x60;
    if (local_5ed0 <= uVar75) break;
LAB_00608e6f:
    local_5ec8 = context->scene;
    uVar79 = 0;
    local_5fc0 = uVar75;
    local_5f60._0_32_ = auVar103;
    local_5ec0 = auVar103;
    while (iVar72 = *(int *)(lVar73 + uVar79 * 4), unaff_R15 = uVar79, iVar72 != -1) {
      uVar2 = *(uint *)(lVar73 + -0x10 + uVar79 * 4);
      pfVar3 = (local_5ec8->vertices).items[uVar2];
      uVar75 = (ulong)*(uint *)(lVar73 + -0x50 + uVar79 * 4);
      fVar81 = pfVar3[uVar75];
      auVar82._4_4_ = fVar81;
      auVar82._0_4_ = fVar81;
      auVar82._8_4_ = fVar81;
      auVar82._12_4_ = fVar81;
      auVar82._16_4_ = fVar81;
      auVar82._20_4_ = fVar81;
      auVar82._24_4_ = fVar81;
      auVar82._28_4_ = fVar81;
      fVar81 = pfVar3[uVar75 + 1];
      auVar117._4_4_ = fVar81;
      auVar117._0_4_ = fVar81;
      auVar117._8_4_ = fVar81;
      auVar117._12_4_ = fVar81;
      auVar117._16_4_ = fVar81;
      auVar117._20_4_ = fVar81;
      auVar117._24_4_ = fVar81;
      auVar117._28_4_ = fVar81;
      fVar81 = pfVar3[uVar75 + 2];
      auVar137._4_4_ = fVar81;
      auVar137._0_4_ = fVar81;
      auVar137._8_4_ = fVar81;
      auVar137._12_4_ = fVar81;
      auVar137._16_4_ = fVar81;
      auVar137._20_4_ = fVar81;
      auVar137._24_4_ = fVar81;
      auVar137._28_4_ = fVar81;
      uVar75 = (ulong)*(uint *)(lVar73 + -0x20 + uVar79 * 4);
      fVar81 = pfVar3[uVar75];
      local_5e40._4_4_ = fVar81;
      local_5e40._0_4_ = fVar81;
      local_5e40._8_4_ = fVar81;
      local_5e40._12_4_ = fVar81;
      local_5e40._16_4_ = fVar81;
      local_5e40._20_4_ = fVar81;
      local_5e40._24_4_ = fVar81;
      local_5e40._28_4_ = fVar81;
      fVar81 = pfVar3[uVar75 + 1];
      local_5840._4_4_ = fVar81;
      local_5840._0_4_ = fVar81;
      local_5840._8_4_ = fVar81;
      local_5840._12_4_ = fVar81;
      local_5840._16_4_ = fVar81;
      local_5840._20_4_ = fVar81;
      local_5840._24_4_ = fVar81;
      local_5840._28_4_ = fVar81;
      fVar81 = pfVar3[uVar75 + 2];
      local_5860._4_4_ = fVar81;
      local_5860._0_4_ = fVar81;
      local_5860._8_4_ = fVar81;
      local_5860._12_4_ = fVar81;
      local_5860._16_4_ = fVar81;
      local_5860._20_4_ = fVar81;
      local_5860._24_4_ = fVar81;
      local_5860._28_4_ = fVar81;
      auVar110 = *(undefined1 (*) [32])ray;
      auVar96 = *(undefined1 (*) [32])(ray + 0x20);
      auVar106 = *(undefined1 (*) [32])(ray + 0x40);
      local_5ce0 = vsubps_avx(auVar82,auVar110);
      local_5d00 = vsubps_avx(auVar117,auVar96);
      local_5d60 = vsubps_avx(auVar137,auVar106);
      auVar144 = vsubps_avx(local_5840,auVar96);
      auVar146 = vsubps_avx(local_5860,auVar106);
      local_5d40 = vsubps_avx(auVar144,local_5d00);
      local_5d20 = vsubps_avx(auVar146,local_5d60);
      auVar162._0_4_ = local_5d00._0_4_ + auVar144._0_4_;
      auVar162._4_4_ = local_5d00._4_4_ + auVar144._4_4_;
      auVar162._8_4_ = local_5d00._8_4_ + auVar144._8_4_;
      auVar162._12_4_ = local_5d00._12_4_ + auVar144._12_4_;
      auVar162._16_4_ = local_5d00._16_4_ + auVar144._16_4_;
      auVar162._20_4_ = local_5d00._20_4_ + auVar144._20_4_;
      auVar162._24_4_ = local_5d00._24_4_ + auVar144._24_4_;
      auVar162._28_4_ = local_5d00._28_4_ + auVar144._28_4_;
      fVar90 = local_5d60._0_4_;
      auVar167._0_4_ = auVar146._0_4_ + fVar90;
      fVar92 = local_5d60._4_4_;
      auVar167._4_4_ = auVar146._4_4_ + fVar92;
      fVar94 = local_5d60._8_4_;
      auVar167._8_4_ = auVar146._8_4_ + fVar94;
      fVar7 = local_5d60._12_4_;
      auVar167._12_4_ = auVar146._12_4_ + fVar7;
      fVar8 = local_5d60._16_4_;
      auVar167._16_4_ = auVar146._16_4_ + fVar8;
      fVar9 = local_5d60._20_4_;
      auVar167._20_4_ = auVar146._20_4_ + fVar9;
      fVar10 = local_5d60._24_4_;
      auVar167._24_4_ = auVar146._24_4_ + fVar10;
      auVar167._28_4_ = auVar146._28_4_ + local_5d60._28_4_;
      auVar124._0_4_ = auVar162._0_4_ * local_5d20._0_4_;
      auVar124._4_4_ = auVar162._4_4_ * local_5d20._4_4_;
      auVar124._8_4_ = auVar162._8_4_ * local_5d20._8_4_;
      auVar124._12_4_ = auVar162._12_4_ * local_5d20._12_4_;
      auVar124._16_4_ = auVar162._16_4_ * local_5d20._16_4_;
      auVar124._20_4_ = auVar162._20_4_ * local_5d20._20_4_;
      auVar124._28_36_ = auVar172._28_36_;
      auVar124._24_4_ = auVar162._24_4_ * local_5d20._24_4_;
      auVar14 = vfmsub231ps_fma(auVar124._0_32_,local_5d40,auVar167);
      auVar147 = vsubps_avx(local_5e40,auVar110);
      local_5d80 = vsubps_avx(auVar147,local_5ce0);
      auVar22._4_4_ = auVar167._4_4_ * local_5d80._4_4_;
      auVar22._0_4_ = auVar167._0_4_ * local_5d80._0_4_;
      auVar22._8_4_ = auVar167._8_4_ * local_5d80._8_4_;
      auVar22._12_4_ = auVar167._12_4_ * local_5d80._12_4_;
      auVar22._16_4_ = auVar167._16_4_ * local_5d80._16_4_;
      auVar22._20_4_ = auVar167._20_4_ * local_5d80._20_4_;
      auVar22._24_4_ = auVar167._24_4_ * local_5d80._24_4_;
      auVar22._28_4_ = auVar167._28_4_;
      auVar179._0_4_ = auVar147._0_4_ + local_5ce0._0_4_;
      auVar179._4_4_ = auVar147._4_4_ + local_5ce0._4_4_;
      auVar179._8_4_ = auVar147._8_4_ + local_5ce0._8_4_;
      auVar179._12_4_ = auVar147._12_4_ + local_5ce0._12_4_;
      auVar179._16_4_ = auVar147._16_4_ + local_5ce0._16_4_;
      auVar179._20_4_ = auVar147._20_4_ + local_5ce0._20_4_;
      auVar179._24_4_ = auVar147._24_4_ + local_5ce0._24_4_;
      auVar179._28_4_ = auVar147._28_4_ + local_5ce0._28_4_;
      auVar95 = vfmsub231ps_fma(auVar22,local_5d20,auVar179);
      auVar23._4_4_ = auVar179._4_4_ * local_5d40._4_4_;
      auVar23._0_4_ = auVar179._0_4_ * local_5d40._0_4_;
      auVar23._8_4_ = auVar179._8_4_ * local_5d40._8_4_;
      auVar23._12_4_ = auVar179._12_4_ * local_5d40._12_4_;
      auVar23._16_4_ = auVar179._16_4_ * local_5d40._16_4_;
      auVar23._20_4_ = auVar179._20_4_ * local_5d40._20_4_;
      auVar23._24_4_ = auVar179._24_4_ * local_5d40._24_4_;
      auVar23._28_4_ = auVar179._28_4_;
      auVar148 = vfmsub231ps_fma(auVar23,local_5d80,auVar162);
      auVar71 = *(undefined1 (*) [28])(ray + 0xc0);
      auVar24._4_4_ = auVar148._4_4_ * *(float *)(ray + 0xc4);
      auVar24._0_4_ = auVar148._0_4_ * *(float *)(ray + 0xc0);
      auVar24._8_4_ = auVar148._8_4_ * *(float *)(ray + 200);
      auVar24._12_4_ = auVar148._12_4_ * *(float *)(ray + 0xcc);
      auVar24._16_4_ = *(float *)(ray + 0xd0) * 0.0;
      auVar24._20_4_ = *(float *)(ray + 0xd4) * 0.0;
      auVar24._24_4_ = *(float *)(ray + 0xd8) * 0.0;
      auVar24._28_4_ = auVar162._28_4_;
      local_5e80 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar95 = vfmadd231ps_fma(auVar24,local_5e80,ZEXT1632(auVar95));
      uVar75 = (ulong)*(uint *)(lVar73 + -0x40 + uVar79 * 4);
      fVar81 = pfVar3[uVar75];
      local_5880._4_4_ = fVar81;
      local_5880._0_4_ = fVar81;
      local_5880._8_4_ = fVar81;
      local_5880._12_4_ = fVar81;
      local_5880._16_4_ = fVar81;
      local_5880._20_4_ = fVar81;
      local_5880._24_4_ = fVar81;
      local_5880._28_4_ = fVar81;
      local_5da0 = *(undefined1 (*) [32])(ray + 0x80);
      auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),local_5da0,ZEXT1632(auVar14));
      auVar111 = vsubps_avx(local_5880,auVar110);
      fVar81 = pfVar3[uVar75 + 1];
      local_58a0._4_4_ = fVar81;
      local_58a0._0_4_ = fVar81;
      local_58a0._8_4_ = fVar81;
      local_58a0._12_4_ = fVar81;
      local_58a0._16_4_ = fVar81;
      local_58a0._20_4_ = fVar81;
      local_58a0._24_4_ = fVar81;
      local_58a0._28_4_ = fVar81;
      auVar96 = vsubps_avx(local_58a0,auVar96);
      fVar81 = pfVar3[uVar75 + 2];
      local_58c0._4_4_ = fVar81;
      local_58c0._0_4_ = fVar81;
      local_58c0._8_4_ = fVar81;
      local_58c0._12_4_ = fVar81;
      local_58c0._16_4_ = fVar81;
      local_58c0._20_4_ = fVar81;
      local_58c0._24_4_ = fVar81;
      local_58c0._28_4_ = fVar81;
      auVar106 = vsubps_avx(local_58c0,auVar106);
      local_5dc0 = vsubps_avx(local_5d00,auVar96);
      local_5de0 = vsubps_avx(local_5d60,auVar106);
      auVar145._0_4_ = local_5d00._0_4_ + auVar96._0_4_;
      auVar145._4_4_ = local_5d00._4_4_ + auVar96._4_4_;
      auVar145._8_4_ = local_5d00._8_4_ + auVar96._8_4_;
      auVar145._12_4_ = local_5d00._12_4_ + auVar96._12_4_;
      auVar145._16_4_ = local_5d00._16_4_ + auVar96._16_4_;
      auVar145._20_4_ = local_5d00._20_4_ + auVar96._20_4_;
      auVar145._24_4_ = local_5d00._24_4_ + auVar96._24_4_;
      auVar145._28_4_ = local_5d00._28_4_ + auVar96._28_4_;
      auVar155._0_4_ = fVar90 + auVar106._0_4_;
      auVar155._4_4_ = fVar92 + auVar106._4_4_;
      auVar155._8_4_ = fVar94 + auVar106._8_4_;
      auVar155._12_4_ = fVar7 + auVar106._12_4_;
      auVar155._16_4_ = fVar8 + auVar106._16_4_;
      auVar155._20_4_ = fVar9 + auVar106._20_4_;
      auVar155._24_4_ = fVar10 + auVar106._24_4_;
      auVar155._28_4_ = local_5d60._28_4_ + auVar106._28_4_;
      fVar171 = local_5de0._0_4_;
      fVar173 = local_5de0._4_4_;
      auVar25._4_4_ = fVar173 * auVar145._4_4_;
      auVar25._0_4_ = fVar171 * auVar145._0_4_;
      fVar174 = local_5de0._8_4_;
      auVar25._8_4_ = fVar174 * auVar145._8_4_;
      fVar175 = local_5de0._12_4_;
      auVar25._12_4_ = fVar175 * auVar145._12_4_;
      fVar176 = local_5de0._16_4_;
      auVar25._16_4_ = fVar176 * auVar145._16_4_;
      fVar177 = local_5de0._20_4_;
      auVar25._20_4_ = fVar177 * auVar145._20_4_;
      fVar178 = local_5de0._24_4_;
      auVar25._24_4_ = fVar178 * auVar145._24_4_;
      auVar25._28_4_ = auVar110._28_4_;
      auVar148 = vfmsub231ps_fma(auVar25,local_5dc0,auVar155);
      auVar107 = vsubps_avx(local_5ce0,auVar111);
      fVar81 = auVar107._0_4_;
      fVar91 = auVar107._4_4_;
      auVar26._4_4_ = auVar155._4_4_ * fVar91;
      auVar26._0_4_ = auVar155._0_4_ * fVar81;
      fVar11 = auVar107._8_4_;
      auVar26._8_4_ = auVar155._8_4_ * fVar11;
      fVar13 = auVar107._12_4_;
      auVar26._12_4_ = auVar155._12_4_ * fVar13;
      fVar126 = auVar107._16_4_;
      auVar26._16_4_ = auVar155._16_4_ * fVar126;
      fVar130 = auVar107._20_4_;
      auVar26._20_4_ = auVar155._20_4_ * fVar130;
      fVar134 = auVar107._24_4_;
      auVar26._24_4_ = auVar155._24_4_ * fVar134;
      auVar26._28_4_ = auVar155._28_4_;
      auVar149._0_4_ = local_5ce0._0_4_ + auVar111._0_4_;
      auVar149._4_4_ = local_5ce0._4_4_ + auVar111._4_4_;
      auVar149._8_4_ = local_5ce0._8_4_ + auVar111._8_4_;
      auVar149._12_4_ = local_5ce0._12_4_ + auVar111._12_4_;
      auVar149._16_4_ = local_5ce0._16_4_ + auVar111._16_4_;
      auVar149._20_4_ = local_5ce0._20_4_ + auVar111._20_4_;
      auVar149._24_4_ = local_5ce0._24_4_ + auVar111._24_4_;
      auVar149._28_4_ = local_5ce0._28_4_ + auVar111._28_4_;
      auVar14 = vfmsub231ps_fma(auVar26,local_5de0,auVar149);
      fVar89 = local_5dc0._0_4_;
      fVar93 = local_5dc0._4_4_;
      auVar27._4_4_ = auVar149._4_4_ * fVar93;
      auVar27._0_4_ = auVar149._0_4_ * fVar89;
      fVar12 = local_5dc0._8_4_;
      auVar27._8_4_ = auVar149._8_4_ * fVar12;
      fVar116 = local_5dc0._12_4_;
      auVar27._12_4_ = auVar149._12_4_ * fVar116;
      fVar128 = local_5dc0._16_4_;
      auVar27._16_4_ = auVar149._16_4_ * fVar128;
      fVar132 = local_5dc0._20_4_;
      auVar27._20_4_ = auVar149._20_4_ * fVar132;
      fVar136 = local_5dc0._24_4_;
      auVar27._24_4_ = auVar149._24_4_ * fVar136;
      auVar27._28_4_ = auVar149._28_4_;
      auVar15 = vfmsub231ps_fma(auVar27,auVar107,auVar145);
      local_5fa0._0_4_ = auVar71._0_4_;
      local_5fa0._4_4_ = auVar71._4_4_;
      fStack_5f98 = auVar71._8_4_;
      fStack_5f94 = auVar71._12_4_;
      fStack_5f90 = auVar71._16_4_;
      fStack_5f8c = auVar71._20_4_;
      fStack_5f88 = auVar71._24_4_;
      auVar28._4_4_ = auVar15._4_4_ * (float)local_5fa0._4_4_;
      auVar28._0_4_ = auVar15._0_4_ * (float)local_5fa0._0_4_;
      auVar28._8_4_ = auVar15._8_4_ * fStack_5f98;
      auVar28._12_4_ = auVar15._12_4_ * fStack_5f94;
      auVar28._16_4_ = fStack_5f90 * 0.0;
      auVar28._20_4_ = fStack_5f8c * 0.0;
      auVar28._24_4_ = fStack_5f88 * 0.0;
      auVar28._28_4_ = auVar145._28_4_;
      auVar14 = vfmadd231ps_fma(auVar28,local_5e80,ZEXT1632(auVar14));
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),local_5da0,ZEXT1632(auVar148));
      auVar163 = vsubps_avx(auVar111,auVar147);
      auVar83._0_4_ = auVar147._0_4_ + auVar111._0_4_;
      auVar83._4_4_ = auVar147._4_4_ + auVar111._4_4_;
      auVar83._8_4_ = auVar147._8_4_ + auVar111._8_4_;
      auVar83._12_4_ = auVar147._12_4_ + auVar111._12_4_;
      auVar83._16_4_ = auVar147._16_4_ + auVar111._16_4_;
      auVar83._20_4_ = auVar147._20_4_ + auVar111._20_4_;
      auVar83._24_4_ = auVar147._24_4_ + auVar111._24_4_;
      auVar83._28_4_ = auVar147._28_4_ + auVar111._28_4_;
      auVar147 = vsubps_avx(auVar96,auVar144);
      auVar160 = ZEXT3264(auVar147);
      auVar104._0_4_ = auVar96._0_4_ + auVar144._0_4_;
      auVar104._4_4_ = auVar96._4_4_ + auVar144._4_4_;
      auVar104._8_4_ = auVar96._8_4_ + auVar144._8_4_;
      auVar104._12_4_ = auVar96._12_4_ + auVar144._12_4_;
      auVar104._16_4_ = auVar96._16_4_ + auVar144._16_4_;
      auVar104._20_4_ = auVar96._20_4_ + auVar144._20_4_;
      auVar104._24_4_ = auVar96._24_4_ + auVar144._24_4_;
      auVar104._28_4_ = auVar96._28_4_ + auVar144._28_4_;
      auVar111 = vsubps_avx(auVar106,auVar146);
      auVar165 = ZEXT3264(auVar111);
      auVar118._0_4_ = auVar106._0_4_ + auVar146._0_4_;
      auVar118._4_4_ = auVar106._4_4_ + auVar146._4_4_;
      auVar118._8_4_ = auVar106._8_4_ + auVar146._8_4_;
      auVar118._12_4_ = auVar106._12_4_ + auVar146._12_4_;
      auVar118._16_4_ = auVar106._16_4_ + auVar146._16_4_;
      auVar118._20_4_ = auVar106._20_4_ + auVar146._20_4_;
      auVar118._24_4_ = auVar106._24_4_ + auVar146._24_4_;
      auVar118._28_4_ = auVar106._28_4_ + auVar146._28_4_;
      auVar29._4_4_ = auVar111._4_4_ * auVar104._4_4_;
      auVar29._0_4_ = auVar111._0_4_ * auVar104._0_4_;
      auVar29._8_4_ = auVar111._8_4_ * auVar104._8_4_;
      auVar29._12_4_ = auVar111._12_4_ * auVar104._12_4_;
      auVar29._16_4_ = auVar111._16_4_ * auVar104._16_4_;
      auVar29._20_4_ = auVar111._20_4_ * auVar104._20_4_;
      auVar29._24_4_ = auVar111._24_4_ * auVar104._24_4_;
      auVar29._28_4_ = auVar107._28_4_;
      auVar15 = vfmsub231ps_fma(auVar29,auVar147,auVar118);
      auVar30._4_4_ = auVar163._4_4_ * auVar118._4_4_;
      auVar30._0_4_ = auVar163._0_4_ * auVar118._0_4_;
      auVar30._8_4_ = auVar163._8_4_ * auVar118._8_4_;
      auVar30._12_4_ = auVar163._12_4_ * auVar118._12_4_;
      auVar30._16_4_ = auVar163._16_4_ * auVar118._16_4_;
      auVar30._20_4_ = auVar163._20_4_ * auVar118._20_4_;
      auVar30._24_4_ = auVar163._24_4_ * auVar118._24_4_;
      auVar30._28_4_ = auVar118._28_4_;
      auVar148 = vfmsub231ps_fma(auVar30,auVar111,auVar83);
      auVar31._4_4_ = auVar147._4_4_ * auVar83._4_4_;
      auVar31._0_4_ = auVar147._0_4_ * auVar83._0_4_;
      auVar31._8_4_ = auVar147._8_4_ * auVar83._8_4_;
      auVar31._12_4_ = auVar147._12_4_ * auVar83._12_4_;
      auVar31._16_4_ = auVar147._16_4_ * auVar83._16_4_;
      auVar31._20_4_ = auVar147._20_4_ * auVar83._20_4_;
      auVar31._24_4_ = auVar147._24_4_ * auVar83._24_4_;
      auVar31._28_4_ = auVar83._28_4_;
      auVar16 = vfmsub231ps_fma(auVar31,auVar163,auVar104);
      auVar84._0_4_ = auVar16._0_4_ * (float)local_5fa0._0_4_;
      auVar84._4_4_ = auVar16._4_4_ * (float)local_5fa0._4_4_;
      auVar84._8_4_ = auVar16._8_4_ * fStack_5f98;
      auVar84._12_4_ = auVar16._12_4_ * fStack_5f94;
      auVar84._16_4_ = fStack_5f90 * 0.0;
      auVar84._20_4_ = fStack_5f8c * 0.0;
      auVar84._24_4_ = fStack_5f88 * 0.0;
      auVar84._28_4_ = 0;
      auVar148 = vfmadd231ps_fma(auVar84,local_5e80,ZEXT1632(auVar148));
      auVar148 = vfmadd231ps_fma(ZEXT1632(auVar148),local_5da0,ZEXT1632(auVar15));
      auVar146 = ZEXT1632(CONCAT412(auVar148._12_4_ + auVar95._12_4_ + auVar14._12_4_,
                                    CONCAT48(auVar148._8_4_ + auVar95._8_4_ + auVar14._8_4_,
                                             CONCAT44(auVar148._4_4_ + auVar95._4_4_ + auVar14._4_4_
                                                      ,auVar148._0_4_ +
                                                       auVar95._0_4_ + auVar14._0_4_))));
      local_5940 = ZEXT1632(auVar95);
      auVar110 = vminps_avx(local_5940,ZEXT1632(auVar14));
      auVar96 = vminps_avx(auVar110,ZEXT1632(auVar148));
      auVar110 = vandps_avx(auVar146,local_5cc0);
      fVar115 = auVar110._0_4_ * 1.1920929e-07;
      fVar125 = auVar110._4_4_ * 1.1920929e-07;
      auVar32._4_4_ = fVar125;
      auVar32._0_4_ = fVar115;
      fVar127 = auVar110._8_4_ * 1.1920929e-07;
      auVar32._8_4_ = fVar127;
      fVar129 = auVar110._12_4_ * 1.1920929e-07;
      auVar32._12_4_ = fVar129;
      fVar131 = auVar110._16_4_ * 1.1920929e-07;
      auVar32._16_4_ = fVar131;
      fVar133 = auVar110._20_4_ * 1.1920929e-07;
      auVar32._20_4_ = fVar133;
      fVar135 = auVar110._24_4_ * 1.1920929e-07;
      auVar32._24_4_ = fVar135;
      auVar32._28_4_ = 0x34000000;
      local_5e60._8_4_ = 0x80000000;
      local_5e60._0_8_ = 0x8000000080000000;
      local_5e60._12_4_ = 0x80000000;
      local_5e60._16_4_ = 0x80000000;
      local_5e60._20_4_ = 0x80000000;
      local_5e60._24_4_ = 0x80000000;
      local_5e60._28_4_ = 0x80000000;
      auVar152 = ZEXT3264(local_5e60);
      auVar138._0_8_ = CONCAT44(fVar125,fVar115) ^ 0x8000000080000000;
      auVar138._8_4_ = -fVar127;
      auVar138._12_4_ = -fVar129;
      auVar138._16_4_ = -fVar131;
      auVar138._20_4_ = -fVar133;
      auVar138._24_4_ = -fVar135;
      auVar138._28_4_ = 0xb4000000;
      auVar96 = vcmpps_avx(auVar96,auVar138,5);
      auVar144 = vmaxps_avx(local_5940,ZEXT1632(auVar14));
      auVar106 = vmaxps_avx(auVar144,ZEXT1632(auVar148));
      auVar106 = vcmpps_avx(auVar106,auVar32,2);
      auVar96 = vorps_avx(auVar96,auVar106);
      uVar75 = (ulong)*(uint *)(lVar73 + -0x30 + uVar79 * 4);
      auVar106 = local_5f60._0_32_ & auVar96;
      local_58e0 = pfVar3[uVar75];
      local_5900 = pfVar3[uVar75 + 1];
      local_5920 = pfVar3[uVar75 + 2];
      fStack_591c = local_5920;
      fStack_5918 = local_5920;
      fStack_5914 = local_5920;
      fStack_5910 = local_5920;
      fStack_590c = local_5920;
      fStack_5908 = local_5920;
      fStack_5904 = local_5920;
      fStack_58fc = local_5900;
      fStack_58f8 = local_5900;
      fStack_58f4 = local_5900;
      fStack_58f0 = local_5900;
      fStack_58ec = local_5900;
      fStack_58e8 = local_5900;
      fStack_58e4 = local_5900;
      fStack_58dc = local_58e0;
      fStack_58d8 = local_58e0;
      fStack_58d4 = local_58e0;
      fStack_58d0 = local_58e0;
      fStack_58cc = local_58e0;
      fStack_58c8 = local_58e0;
      fStack_58c4 = local_58e0;
      if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar106 >> 0x7f,0) == '\0') &&
            (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar106 >> 0xbf,0) == '\0') &&
          (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar106[0x1f]) {
        auVar170 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
        auVar172 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                      CONCAT424(0x3f7ffffa,
                                                CONCAT420(0x3f7ffffa,
                                                          CONCAT416(0x3f7ffffa,
                                                                    CONCAT412(0x3f7ffffa,
                                                                              CONCAT48(0x3f7ffffa,
                                                                                                                                                                              
                                                  0x3f7ffffa3f7ffffa)))))));
      }
      else {
        auVar33._4_4_ = fVar93 * local_5d20._4_4_;
        auVar33._0_4_ = fVar89 * local_5d20._0_4_;
        auVar33._8_4_ = fVar12 * local_5d20._8_4_;
        auVar33._12_4_ = fVar116 * local_5d20._12_4_;
        auVar33._16_4_ = fVar128 * local_5d20._16_4_;
        auVar33._20_4_ = fVar132 * local_5d20._20_4_;
        auVar33._24_4_ = fVar136 * local_5d20._24_4_;
        auVar33._28_4_ = local_5920;
        auVar34._4_4_ = fVar91 * local_5d40._4_4_;
        auVar34._0_4_ = fVar81 * local_5d40._0_4_;
        auVar34._8_4_ = fVar11 * local_5d40._8_4_;
        auVar34._12_4_ = fVar13 * local_5d40._12_4_;
        auVar34._16_4_ = fVar126 * local_5d40._16_4_;
        auVar34._20_4_ = fVar130 * local_5d40._20_4_;
        auVar34._24_4_ = fVar134 * local_5d40._24_4_;
        auVar34._28_4_ = auVar96._28_4_;
        auVar148 = vfmsub213ps_fma(local_5d40,local_5de0,auVar33);
        auVar35._4_4_ = auVar147._4_4_ * fVar173;
        auVar35._0_4_ = auVar147._0_4_ * fVar171;
        auVar35._8_4_ = auVar147._8_4_ * fVar174;
        auVar35._12_4_ = auVar147._12_4_ * fVar175;
        auVar35._16_4_ = auVar147._16_4_ * fVar176;
        auVar35._20_4_ = auVar147._20_4_ * fVar177;
        auVar35._24_4_ = auVar147._24_4_ * fVar178;
        auVar35._28_4_ = 0x34000000;
        auVar36._4_4_ = fVar91 * auVar111._4_4_;
        auVar36._0_4_ = fVar81 * auVar111._0_4_;
        auVar36._8_4_ = fVar11 * auVar111._8_4_;
        auVar36._12_4_ = fVar13 * auVar111._12_4_;
        auVar36._16_4_ = fVar126 * auVar111._16_4_;
        auVar36._20_4_ = fVar130 * auVar111._20_4_;
        auVar36._24_4_ = fVar134 * auVar111._24_4_;
        auVar36._28_4_ = auVar144._28_4_;
        auVar15 = vfmsub213ps_fma(auVar111,local_5dc0,auVar35);
        auVar106 = vandps_avx(local_5cc0,auVar33);
        auVar144 = vandps_avx(local_5cc0,auVar35);
        auVar106 = vcmpps_avx(auVar106,auVar144,1);
        auVar111 = vblendvps_avx(ZEXT1632(auVar15),ZEXT1632(auVar148),auVar106);
        auVar165 = ZEXT3264(auVar111);
        auVar37._4_4_ = auVar163._4_4_ * fVar93;
        auVar37._0_4_ = auVar163._0_4_ * fVar89;
        auVar37._8_4_ = auVar163._8_4_ * fVar12;
        auVar37._12_4_ = auVar163._12_4_ * fVar116;
        auVar37._16_4_ = auVar163._16_4_ * fVar128;
        auVar37._20_4_ = auVar163._20_4_ * fVar132;
        auVar37._24_4_ = auVar163._24_4_ * fVar136;
        auVar37._28_4_ = auVar106._28_4_;
        auVar148 = vfmsub213ps_fma(auVar163,local_5de0,auVar36);
        auVar38._4_4_ = fVar173 * local_5d80._4_4_;
        auVar38._0_4_ = fVar171 * local_5d80._0_4_;
        auVar38._8_4_ = fVar174 * local_5d80._8_4_;
        auVar38._12_4_ = fVar175 * local_5d80._12_4_;
        auVar38._16_4_ = fVar176 * local_5d80._16_4_;
        auVar38._20_4_ = fVar177 * local_5d80._20_4_;
        auVar38._24_4_ = fVar178 * local_5d80._24_4_;
        auVar38._28_4_ = auVar144._28_4_;
        auVar15 = vfmsub213ps_fma(local_5d20,auVar107,auVar38);
        auVar106 = vandps_avx(local_5cc0,auVar38);
        auVar144 = vandps_avx(local_5cc0,auVar36);
        auVar106 = vcmpps_avx(auVar106,auVar144,1);
        auVar163 = vblendvps_avx(ZEXT1632(auVar148),ZEXT1632(auVar15),auVar106);
        auVar148 = vfmsub213ps_fma(local_5d80,local_5dc0,auVar34);
        auVar15 = vfmsub213ps_fma(auVar147,auVar107,auVar37);
        auVar106 = vandps_avx(local_5cc0,auVar34);
        auVar144 = vandps_avx(local_5cc0,auVar37);
        auVar106 = vcmpps_avx(auVar106,auVar144,1);
        auVar147 = vblendvps_avx(ZEXT1632(auVar15),ZEXT1632(auVar148),auVar106);
        auVar39._4_4_ = auVar147._4_4_ * (float)local_5fa0._4_4_;
        auVar39._0_4_ = auVar147._0_4_ * (float)local_5fa0._0_4_;
        auVar39._8_4_ = auVar147._8_4_ * fStack_5f98;
        auVar39._12_4_ = auVar147._12_4_ * fStack_5f94;
        auVar39._16_4_ = auVar147._16_4_ * fStack_5f90;
        auVar39._20_4_ = auVar147._20_4_ * fStack_5f8c;
        auVar39._24_4_ = auVar147._24_4_ * fStack_5f88;
        auVar39._28_4_ = auVar106._28_4_;
        auVar148 = vfmadd213ps_fma(local_5e80,auVar163,auVar39);
        auVar148 = vfmadd213ps_fma(local_5da0,auVar111,ZEXT1632(auVar148));
        fVar81 = auVar148._0_4_ + auVar148._0_4_;
        fVar89 = auVar148._4_4_ + auVar148._4_4_;
        fVar91 = auVar148._8_4_ + auVar148._8_4_;
        fVar93 = auVar148._12_4_ + auVar148._12_4_;
        auVar107 = ZEXT1632(CONCAT412(fVar93,CONCAT48(fVar91,CONCAT44(fVar89,fVar81))));
        auVar105._0_4_ = auVar147._0_4_ * fVar90;
        auVar105._4_4_ = auVar147._4_4_ * fVar92;
        auVar105._8_4_ = auVar147._8_4_ * fVar94;
        auVar105._12_4_ = auVar147._12_4_ * fVar7;
        auVar105._16_4_ = auVar147._16_4_ * fVar8;
        auVar105._20_4_ = auVar147._20_4_ * fVar9;
        auVar105._24_4_ = auVar147._24_4_ * fVar10;
        auVar105._28_4_ = 0;
        auVar148 = vfmadd213ps_fma(local_5d00,auVar163,auVar105);
        auVar15 = vfmadd213ps_fma(local_5ce0,auVar111,ZEXT1632(auVar148));
        auVar106 = vrcpps_avx(auVar107);
        auVar156._8_4_ = 0x3f800000;
        auVar156._0_8_ = 0x3f8000003f800000;
        auVar156._12_4_ = 0x3f800000;
        auVar156._16_4_ = 0x3f800000;
        auVar156._20_4_ = 0x3f800000;
        auVar156._24_4_ = 0x3f800000;
        auVar156._28_4_ = 0x3f800000;
        auVar160 = ZEXT3264(auVar156);
        auVar148 = vfnmadd213ps_fma(auVar106,auVar107,auVar156);
        auVar148 = vfmadd132ps_fma(ZEXT1632(auVar148),auVar106,auVar106);
        auVar40._28_4_ = auVar106._28_4_;
        auVar40._0_28_ =
             ZEXT1628(CONCAT412((auVar15._12_4_ + auVar15._12_4_) * auVar148._12_4_,
                                CONCAT48((auVar15._8_4_ + auVar15._8_4_) * auVar148._8_4_,
                                         CONCAT44((auVar15._4_4_ + auVar15._4_4_) * auVar148._4_4_,
                                                  (auVar15._0_4_ + auVar15._0_4_) * auVar148._0_4_))
                               ));
        _local_5fa0 = *(undefined1 (*) [32])(ray + 0x100);
        auVar106 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar40,2);
        auVar144 = vcmpps_avx(auVar40,_local_5fa0,2);
        auVar106 = vandps_avx(auVar106,auVar144);
        auVar139._0_8_ = CONCAT44(fVar89,fVar81) ^ 0x8000000080000000;
        auVar139._8_4_ = -fVar91;
        auVar139._12_4_ = -fVar93;
        auVar139._16_4_ = 0x80000000;
        auVar139._20_4_ = 0x80000000;
        auVar139._24_4_ = 0x80000000;
        auVar139._28_4_ = 0x80000000;
        auVar144 = vcmpps_avx(auVar107,auVar139,4);
        auVar106 = vandps_avx(auVar144,auVar106);
        auVar144 = vandps_avx(local_5f60._0_32_,auVar96);
        auVar106 = vpslld_avx2(auVar106,0x1f);
        auVar107 = vpsrad_avx2(auVar106,0x1f);
        auVar106 = auVar144 & auVar107;
        local_5e20 = auVar110;
        local_5e00 = auVar96;
        local_5960 = auVar146;
        if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar106 >> 0x7f,0) == '\0') &&
              (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar106 >> 0xbf,0) == '\0') &&
            (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar106[0x1f]) {
          auVar170 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          auVar172 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                        CONCAT424(0x3f7ffffa,
                                                  CONCAT420(0x3f7ffffa,
                                                            CONCAT416(0x3f7ffffa,
                                                                      CONCAT412(0x3f7ffffa,
                                                                                CONCAT48(0x3f7ffffa,
                                                                                                                                                                                  
                                                  0x3f7ffffa3f7ffffa)))))));
        }
        else {
          auVar160 = ZEXT3264(auVar110);
          auVar96 = vandps_avx(auVar107,auVar144);
          pGVar4 = (context->scene->geometries).items[uVar2].ptr;
          uVar1 = pGVar4->mask;
          auVar108._4_4_ = uVar1;
          auVar108._0_4_ = uVar1;
          auVar108._8_4_ = uVar1;
          auVar108._12_4_ = uVar1;
          auVar108._16_4_ = uVar1;
          auVar108._20_4_ = uVar1;
          auVar108._24_4_ = uVar1;
          auVar108._28_4_ = uVar1;
          auVar106 = vpand_avx2(auVar108,*(undefined1 (*) [32])(ray + 0x120));
          auVar144 = vpcmpeqd_avx2(auVar106,_DAT_01faff00);
          auVar106 = auVar96 & ~auVar144;
          auVar170 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          auVar172 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                        CONCAT424(0x3f7ffffa,
                                                  CONCAT420(0x3f7ffffa,
                                                            CONCAT416(0x3f7ffffa,
                                                                      CONCAT412(0x3f7ffffa,
                                                                                CONCAT48(0x3f7ffffa,
                                                                                                                                                                                  
                                                  0x3f7ffffa3f7ffffa)))))));
          auVar107 = vpcmpeqd_avx2(local_5e60,local_5e60);
          auVar152 = ZEXT3264(auVar107);
          if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar106 >> 0x7f,0) != '\0') ||
                (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar106 >> 0xbf,0) != '\0') ||
              (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar106[0x1f] < '\0') {
            auVar96 = vandnps_avx(auVar144,auVar96);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar106 = vrcpps_avx(auVar146);
              auVar142._8_4_ = 0x3f800000;
              auVar142._0_8_ = 0x3f8000003f800000;
              auVar142._12_4_ = 0x3f800000;
              auVar142._16_4_ = 0x3f800000;
              auVar142._20_4_ = 0x3f800000;
              auVar142._24_4_ = 0x3f800000;
              auVar142._28_4_ = 0x3f800000;
              auVar148 = vfnmadd213ps_fma(auVar146,auVar106,auVar142);
              auVar148 = vfmadd132ps_fma(ZEXT1632(auVar148),auVar106,auVar106);
              auVar86._8_4_ = 0x219392ef;
              auVar86._0_8_ = 0x219392ef219392ef;
              auVar86._12_4_ = 0x219392ef;
              auVar86._16_4_ = 0x219392ef;
              auVar86._20_4_ = 0x219392ef;
              auVar86._24_4_ = 0x219392ef;
              auVar86._28_4_ = 0x219392ef;
              auVar110 = vcmpps_avx(auVar110,auVar86,5);
              auVar110 = vandps_avx(ZEXT1632(auVar148),auVar110);
              auVar59._4_4_ = auVar110._4_4_ * auVar95._4_4_;
              auVar59._0_4_ = auVar110._0_4_ * auVar95._0_4_;
              auVar59._8_4_ = auVar110._8_4_ * auVar95._8_4_;
              auVar59._12_4_ = auVar110._12_4_ * auVar95._12_4_;
              auVar59._16_4_ = auVar110._16_4_ * 0.0;
              auVar59._20_4_ = auVar110._20_4_ * 0.0;
              auVar59._24_4_ = auVar110._24_4_ * 0.0;
              auVar59._28_4_ = 0x3f800000;
              auVar159._8_4_ = 0x3f800000;
              auVar159._0_8_ = 0x3f8000003f800000;
              auVar159._12_4_ = 0x3f800000;
              auVar159._16_4_ = 0x3f800000;
              auVar159._20_4_ = 0x3f800000;
              auVar159._24_4_ = 0x3f800000;
              auVar159._28_4_ = 0x3f800000;
              auVar106 = vminps_avx(auVar59,auVar159);
              auVar60._4_4_ = auVar14._4_4_ * auVar110._4_4_;
              auVar60._0_4_ = auVar14._0_4_ * auVar110._0_4_;
              auVar60._8_4_ = auVar14._8_4_ * auVar110._8_4_;
              auVar60._12_4_ = auVar14._12_4_ * auVar110._12_4_;
              auVar60._16_4_ = auVar110._16_4_ * 0.0;
              auVar60._20_4_ = auVar110._20_4_ * 0.0;
              auVar60._24_4_ = auVar110._24_4_ * 0.0;
              auVar60._28_4_ = auVar110._28_4_;
              auVar110 = vminps_avx(auVar60,auVar159);
              auVar144 = vsubps_avx(auVar159,auVar106);
              auVar146 = vsubps_avx(auVar159,auVar110);
              auVar67._8_8_ = uStack_5978;
              auVar67._0_8_ = local_5980;
              auVar67._16_8_ = uStack_5970;
              auVar67._24_8_ = uStack_5968;
              local_5c40 = vblendvps_avx(auVar106,auVar144,auVar67);
              local_5c20 = vblendvps_avx(auVar110,auVar146,auVar67);
              pRVar5 = context->user;
              auVar95._4_4_ = iVar72;
              auVar95._0_4_ = iVar72;
              auVar95._8_4_ = iVar72;
              auVar95._12_4_ = iVar72;
              local_5c00._16_4_ = iVar72;
              local_5c00._0_16_ = auVar95;
              local_5c00._20_4_ = iVar72;
              local_5c00._24_4_ = iVar72;
              local_5c00._28_4_ = iVar72;
              auVar160 = ZEXT3264(local_5c00);
              local_5f38[1] = auVar107;
              *local_5f38 = auVar107;
              local_5bc0 = pRVar5->instID[0];
              local_5ba0 = pRVar5->instPrimID[0];
              auVar110 = vblendvps_avx(_local_5fa0,auVar40,auVar96);
              *(undefined1 (*) [32])(ray + 0x100) = auVar110;
              local_5f30.valid = (int *)local_5f00;
              local_5f30.geometryUserPtr = pGVar4->userPtr;
              local_5f30.context = context->user;
              local_5f30.hit = local_5ca0;
              local_5f30.N = 8;
              local_5f30.ray = (RTCRayN *)ray;
              local_5f00 = auVar96;
              local_5ca0 = (RTCHitN  [32])auVar111;
              local_5c80 = auVar163;
              local_5c60 = auVar147;
              local_5be0 = uVar2;
              uStack_5bdc = uVar2;
              uStack_5bd8 = uVar2;
              uStack_5bd4 = uVar2;
              uStack_5bd0 = uVar2;
              uStack_5bcc = uVar2;
              uStack_5bc8 = uVar2;
              uStack_5bc4 = uVar2;
              uStack_5bbc = local_5bc0;
              uStack_5bb8 = local_5bc0;
              uStack_5bb4 = local_5bc0;
              uStack_5bb0 = local_5bc0;
              uStack_5bac = local_5bc0;
              uStack_5ba8 = local_5bc0;
              uStack_5ba4 = local_5bc0;
              uStack_5b9c = local_5ba0;
              uStack_5b98 = local_5ba0;
              uStack_5b94 = local_5ba0;
              uStack_5b90 = local_5ba0;
              uStack_5b8c = local_5ba0;
              uStack_5b88 = local_5ba0;
              uStack_5b84 = local_5ba0;
              if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                auVar110 = ZEXT1632(auVar107._0_16_);
                auVar160 = ZEXT1664(auVar95);
                auVar165 = ZEXT1664(auVar111._0_16_);
                (*pGVar4->occlusionFilterN)(&local_5f30);
                auVar110 = vpcmpeqd_avx2(auVar110,auVar110);
                auVar152 = ZEXT3264(auVar110);
                auVar172 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                              CONCAT424(0x3f7ffffa,
                                                        CONCAT420(0x3f7ffffa,
                                                                  CONCAT416(0x3f7ffffa,
                                                                            CONCAT412(0x3f7ffffa,
                                                                                      CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                auVar170 = ZEXT3264(CONCAT428(0x7f800000,
                                              CONCAT424(0x7f800000,
                                                        CONCAT420(0x7f800000,
                                                                  CONCAT416(0x7f800000,
                                                                            CONCAT412(0x7f800000,
                                                                                      CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                uVar76 = local_5fb8;
                ray = local_5fb0;
                context = local_5fa8;
              }
              auVar96 = vpcmpeqd_avx2(local_5f00,_DAT_01faff00);
              auVar110 = auVar152._0_32_ & ~auVar96;
              if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar110 >> 0x7f,0) == '\0') &&
                    (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar110 >> 0xbf,0) == '\0') &&
                  (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar110[0x1f]) {
                auVar96 = auVar96 ^ auVar152._0_32_;
              }
              else {
                p_Var6 = context->args->filter;
                if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))))
                {
                  auVar110 = ZEXT1632(auVar152._0_16_);
                  auVar160 = ZEXT1664(auVar160._0_16_);
                  auVar165 = ZEXT1664(auVar165._0_16_);
                  (*p_Var6)(&local_5f30);
                  auVar110 = vpcmpeqd_avx2(auVar110,auVar110);
                  auVar152 = ZEXT3264(auVar110);
                  auVar172 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                CONCAT424(0x3f7ffffa,
                                                          CONCAT420(0x3f7ffffa,
                                                                    CONCAT416(0x3f7ffffa,
                                                                              CONCAT412(0x3f7ffffa,
                                                                                        CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                  auVar170 = ZEXT3264(CONCAT428(0x7f800000,
                                                CONCAT424(0x7f800000,
                                                          CONCAT420(0x7f800000,
                                                                    CONCAT416(0x7f800000,
                                                                              CONCAT412(0x7f800000,
                                                                                        CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                  uVar76 = local_5fb8;
                  ray = local_5fb0;
                  context = local_5fa8;
                }
                auVar110 = vpcmpeqd_avx2(local_5f00,_DAT_01faff00);
                auVar96 = auVar110 ^ auVar152._0_32_;
                auVar122._8_4_ = 0xff800000;
                auVar122._0_8_ = 0xff800000ff800000;
                auVar122._12_4_ = 0xff800000;
                auVar122._16_4_ = 0xff800000;
                auVar122._20_4_ = 0xff800000;
                auVar122._24_4_ = 0xff800000;
                auVar122._28_4_ = 0xff800000;
                auVar110 = vblendvps_avx(auVar122,*(undefined1 (*) [32])(local_5f30.ray + 0x100),
                                         auVar110);
                *(undefined1 (*) [32])(local_5f30.ray + 0x100) = auVar110;
              }
              auVar110 = vblendvps_avx(_local_5fa0,*(undefined1 (*) [32])local_5f68,auVar96);
              *(undefined1 (*) [32])local_5f68 = auVar110;
            }
            local_5f60._0_32_ = vandnps_avx(auVar96,local_5f60._0_32_);
          }
        }
      }
      if ((((((((local_5f60._0_32_ >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_5f60._0_32_ >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_5f60._0_32_ >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_5f60._0_32_ >> 0x7f,0) == '\0') &&
            (local_5f60._0_32_ & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_5f60._0_32_ >> 0xbf,0) == '\0') &&
          (local_5f60._0_32_ & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_5f60[0x1f]) break;
      auVar110 = *(undefined1 (*) [32])ray;
      auVar96 = *(undefined1 (*) [32])(ray + 0x20);
      auVar106 = *(undefined1 (*) [32])(ray + 0x40);
      auVar70._4_4_ = fStack_58dc;
      auVar70._0_4_ = local_58e0;
      auVar70._8_4_ = fStack_58d8;
      auVar70._12_4_ = fStack_58d4;
      auVar70._16_4_ = fStack_58d0;
      auVar70._20_4_ = fStack_58cc;
      auVar70._24_4_ = fStack_58c8;
      auVar70._28_4_ = fStack_58c4;
      local_5ce0 = vsubps_avx(auVar70,auVar110);
      auVar69._4_4_ = fStack_58fc;
      auVar69._0_4_ = local_5900;
      auVar69._8_4_ = fStack_58f8;
      auVar69._12_4_ = fStack_58f4;
      auVar69._16_4_ = fStack_58f0;
      auVar69._20_4_ = fStack_58ec;
      auVar69._24_4_ = fStack_58e8;
      auVar69._28_4_ = fStack_58e4;
      local_5d00 = vsubps_avx(auVar69,auVar96);
      auVar68._4_4_ = fStack_591c;
      auVar68._0_4_ = local_5920;
      auVar68._8_4_ = fStack_5918;
      auVar68._12_4_ = fStack_5914;
      auVar68._16_4_ = fStack_5910;
      auVar68._20_4_ = fStack_590c;
      auVar68._24_4_ = fStack_5908;
      auVar68._28_4_ = fStack_5904;
      local_5d20 = vsubps_avx(auVar68,auVar106);
      auVar144 = vsubps_avx(local_5e40,auVar110);
      auVar146 = vsubps_avx(local_5840,auVar96);
      auVar147 = vsubps_avx(local_5860,auVar106);
      auVar111 = vsubps_avx(local_5880,auVar110);
      auVar96 = vsubps_avx(local_58a0,auVar96);
      auVar106 = vsubps_avx(local_58c0,auVar106);
      local_5d40 = vsubps_avx(auVar111,local_5ce0);
      local_5d80 = vsubps_avx(auVar96,local_5d00);
      local_5d60 = vsubps_avx(auVar106,local_5d20);
      auVar157._0_4_ = auVar111._0_4_ + local_5ce0._0_4_;
      auVar157._4_4_ = auVar111._4_4_ + local_5ce0._4_4_;
      auVar157._8_4_ = auVar111._8_4_ + local_5ce0._8_4_;
      auVar157._12_4_ = auVar111._12_4_ + local_5ce0._12_4_;
      auVar157._16_4_ = auVar111._16_4_ + local_5ce0._16_4_;
      auVar157._20_4_ = auVar111._20_4_ + local_5ce0._20_4_;
      auVar157._24_4_ = auVar111._24_4_ + local_5ce0._24_4_;
      auVar157._28_4_ = auVar111._28_4_ + local_5ce0._28_4_;
      auVar164._0_4_ = auVar96._0_4_ + local_5d00._0_4_;
      auVar164._4_4_ = auVar96._4_4_ + local_5d00._4_4_;
      auVar164._8_4_ = auVar96._8_4_ + local_5d00._8_4_;
      auVar164._12_4_ = auVar96._12_4_ + local_5d00._12_4_;
      auVar164._16_4_ = auVar96._16_4_ + local_5d00._16_4_;
      auVar164._20_4_ = auVar96._20_4_ + local_5d00._20_4_;
      auVar164._24_4_ = auVar96._24_4_ + local_5d00._24_4_;
      fVar81 = local_5d00._28_4_;
      auVar164._28_4_ = auVar96._28_4_ + fVar81;
      fVar115 = local_5d20._0_4_;
      auVar169._0_4_ = fVar115 + auVar106._0_4_;
      fVar127 = local_5d20._4_4_;
      auVar169._4_4_ = fVar127 + auVar106._4_4_;
      fVar131 = local_5d20._8_4_;
      auVar169._8_4_ = fVar131 + auVar106._8_4_;
      fVar135 = local_5d20._12_4_;
      auVar169._12_4_ = fVar135 + auVar106._12_4_;
      fVar173 = local_5d20._16_4_;
      auVar169._16_4_ = fVar173 + auVar106._16_4_;
      fVar175 = local_5d20._20_4_;
      auVar169._20_4_ = fVar175 + auVar106._20_4_;
      fVar177 = local_5d20._24_4_;
      auVar169._24_4_ = fVar177 + auVar106._24_4_;
      auVar169._28_4_ = local_5d20._28_4_ + auVar106._28_4_;
      auVar152._0_4_ = auVar164._0_4_ * local_5d60._0_4_;
      auVar152._4_4_ = auVar164._4_4_ * local_5d60._4_4_;
      auVar152._8_4_ = auVar164._8_4_ * local_5d60._8_4_;
      auVar152._12_4_ = auVar164._12_4_ * local_5d60._12_4_;
      auVar152._16_4_ = auVar164._16_4_ * local_5d60._16_4_;
      auVar152._20_4_ = auVar164._20_4_ * local_5d60._20_4_;
      auVar152._28_36_ = auVar172._28_36_;
      auVar152._24_4_ = auVar164._24_4_ * local_5d60._24_4_;
      auVar14 = vfmsub231ps_fma(auVar152._0_32_,local_5d80,auVar169);
      auVar41._4_4_ = auVar169._4_4_ * local_5d40._4_4_;
      auVar41._0_4_ = auVar169._0_4_ * local_5d40._0_4_;
      auVar41._8_4_ = auVar169._8_4_ * local_5d40._8_4_;
      auVar41._12_4_ = auVar169._12_4_ * local_5d40._12_4_;
      auVar41._16_4_ = auVar169._16_4_ * local_5d40._16_4_;
      auVar41._20_4_ = auVar169._20_4_ * local_5d40._20_4_;
      auVar41._24_4_ = auVar169._24_4_ * local_5d40._24_4_;
      auVar41._28_4_ = auVar169._28_4_;
      auVar95 = vfmsub231ps_fma(auVar41,local_5d60,auVar157);
      auVar42._4_4_ = auVar157._4_4_ * local_5d80._4_4_;
      auVar42._0_4_ = auVar157._0_4_ * local_5d80._0_4_;
      auVar42._8_4_ = auVar157._8_4_ * local_5d80._8_4_;
      auVar42._12_4_ = auVar157._12_4_ * local_5d80._12_4_;
      auVar42._16_4_ = auVar157._16_4_ * local_5d80._16_4_;
      auVar42._20_4_ = auVar157._20_4_ * local_5d80._20_4_;
      auVar42._24_4_ = auVar157._24_4_ * local_5d80._24_4_;
      auVar42._28_4_ = auVar157._28_4_;
      auVar148 = vfmsub231ps_fma(auVar42,local_5d40,auVar164);
      fVar116 = *(float *)(ray + 0xc0);
      fVar126 = *(float *)(ray + 0xc4);
      fVar128 = *(float *)(ray + 200);
      fVar130 = *(float *)(ray + 0xcc);
      fVar132 = *(float *)(ray + 0xd0);
      fVar134 = *(float *)(ray + 0xd4);
      fVar136 = *(float *)(ray + 0xd8);
      auVar71 = *(undefined1 (*) [28])(ray + 0xc0);
      auVar43._4_4_ = auVar148._4_4_ * fVar126;
      auVar43._0_4_ = auVar148._0_4_ * fVar116;
      auVar43._8_4_ = auVar148._8_4_ * fVar128;
      auVar43._12_4_ = auVar148._12_4_ * fVar130;
      auVar43._16_4_ = fVar132 * 0.0;
      auVar43._20_4_ = fVar134 * 0.0;
      auVar43._24_4_ = fVar136 * 0.0;
      auVar43._28_4_ = local_5d80._28_4_;
      local_5e80 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar95 = vfmadd231ps_fma(auVar43,local_5e80,ZEXT1632(auVar95));
      auVar110 = *(undefined1 (*) [32])(ray + 0x80);
      auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar110,ZEXT1632(auVar14));
      local_5da0 = vsubps_avx(local_5d00,auVar146);
      auVar107 = vsubps_avx(local_5d20,auVar147);
      auVar158._0_4_ = auVar146._0_4_ + local_5d00._0_4_;
      auVar158._4_4_ = auVar146._4_4_ + local_5d00._4_4_;
      auVar158._8_4_ = auVar146._8_4_ + local_5d00._8_4_;
      auVar158._12_4_ = auVar146._12_4_ + local_5d00._12_4_;
      auVar158._16_4_ = auVar146._16_4_ + local_5d00._16_4_;
      auVar158._20_4_ = auVar146._20_4_ + local_5d00._20_4_;
      auVar158._24_4_ = auVar146._24_4_ + local_5d00._24_4_;
      auVar158._28_4_ = auVar146._28_4_ + fVar81;
      auVar119._0_4_ = fVar115 + auVar147._0_4_;
      auVar119._4_4_ = fVar127 + auVar147._4_4_;
      auVar119._8_4_ = fVar131 + auVar147._8_4_;
      auVar119._12_4_ = fVar135 + auVar147._12_4_;
      auVar119._16_4_ = fVar173 + auVar147._16_4_;
      auVar119._20_4_ = fVar175 + auVar147._20_4_;
      auVar119._24_4_ = fVar177 + auVar147._24_4_;
      auVar119._28_4_ = local_5d20._28_4_ + auVar147._28_4_;
      fVar90 = auVar107._0_4_;
      fVar92 = auVar107._4_4_;
      auVar44._4_4_ = auVar158._4_4_ * fVar92;
      auVar44._0_4_ = auVar158._0_4_ * fVar90;
      fVar7 = auVar107._8_4_;
      auVar44._8_4_ = auVar158._8_4_ * fVar7;
      fVar9 = auVar107._12_4_;
      auVar44._12_4_ = auVar158._12_4_ * fVar9;
      fVar89 = auVar107._16_4_;
      auVar44._16_4_ = auVar158._16_4_ * fVar89;
      fVar93 = auVar107._20_4_;
      auVar44._20_4_ = auVar158._20_4_ * fVar93;
      fVar12 = auVar107._24_4_;
      auVar44._24_4_ = auVar158._24_4_ * fVar12;
      auVar44._28_4_ = fVar81;
      auVar148 = vfmsub231ps_fma(auVar44,local_5da0,auVar119);
      auVar163 = vsubps_avx(local_5ce0,auVar144);
      fVar125 = auVar163._0_4_;
      fVar129 = auVar163._4_4_;
      auVar45._4_4_ = fVar129 * auVar119._4_4_;
      auVar45._0_4_ = fVar125 * auVar119._0_4_;
      fVar133 = auVar163._8_4_;
      auVar45._8_4_ = fVar133 * auVar119._8_4_;
      fVar171 = auVar163._12_4_;
      auVar45._12_4_ = fVar171 * auVar119._12_4_;
      fVar174 = auVar163._16_4_;
      auVar45._16_4_ = fVar174 * auVar119._16_4_;
      fVar176 = auVar163._20_4_;
      auVar45._20_4_ = fVar176 * auVar119._20_4_;
      fVar178 = auVar163._24_4_;
      auVar45._24_4_ = fVar178 * auVar119._24_4_;
      auVar45._28_4_ = auVar119._28_4_;
      auVar153._0_4_ = local_5ce0._0_4_ + auVar144._0_4_;
      auVar153._4_4_ = local_5ce0._4_4_ + auVar144._4_4_;
      auVar153._8_4_ = local_5ce0._8_4_ + auVar144._8_4_;
      auVar153._12_4_ = local_5ce0._12_4_ + auVar144._12_4_;
      auVar153._16_4_ = local_5ce0._16_4_ + auVar144._16_4_;
      auVar153._20_4_ = local_5ce0._20_4_ + auVar144._20_4_;
      auVar153._24_4_ = local_5ce0._24_4_ + auVar144._24_4_;
      auVar153._28_4_ = local_5ce0._28_4_ + auVar144._28_4_;
      auVar14 = vfmsub231ps_fma(auVar45,auVar107,auVar153);
      fVar81 = local_5da0._0_4_;
      fVar94 = local_5da0._4_4_;
      auVar46._4_4_ = auVar153._4_4_ * fVar94;
      auVar46._0_4_ = auVar153._0_4_ * fVar81;
      fVar8 = local_5da0._8_4_;
      auVar46._8_4_ = auVar153._8_4_ * fVar8;
      fVar10 = local_5da0._12_4_;
      auVar46._12_4_ = auVar153._12_4_ * fVar10;
      fVar91 = local_5da0._16_4_;
      auVar46._16_4_ = auVar153._16_4_ * fVar91;
      fVar11 = local_5da0._20_4_;
      auVar46._20_4_ = auVar153._20_4_ * fVar11;
      fVar13 = local_5da0._24_4_;
      auVar46._24_4_ = auVar153._24_4_ * fVar13;
      auVar46._28_4_ = auVar153._28_4_;
      auVar15 = vfmsub231ps_fma(auVar46,auVar163,auVar158);
      auVar154._0_4_ = fVar116 * auVar15._0_4_;
      auVar154._4_4_ = fVar126 * auVar15._4_4_;
      auVar154._8_4_ = fVar128 * auVar15._8_4_;
      auVar154._12_4_ = fVar130 * auVar15._12_4_;
      auVar154._16_4_ = fVar132 * 0.0;
      auVar154._20_4_ = fVar134 * 0.0;
      auVar154._24_4_ = fVar136 * 0.0;
      auVar154._28_4_ = 0;
      auVar14 = vfmadd231ps_fma(auVar154,local_5e80,ZEXT1632(auVar14));
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar110,ZEXT1632(auVar148));
      auVar168 = vsubps_avx(auVar144,auVar111);
      auVar160 = ZEXT3264(auVar168);
      auVar120._0_4_ = auVar144._0_4_ + auVar111._0_4_;
      auVar120._4_4_ = auVar144._4_4_ + auVar111._4_4_;
      auVar120._8_4_ = auVar144._8_4_ + auVar111._8_4_;
      auVar120._12_4_ = auVar144._12_4_ + auVar111._12_4_;
      auVar120._16_4_ = auVar144._16_4_ + auVar111._16_4_;
      auVar120._20_4_ = auVar144._20_4_ + auVar111._20_4_;
      auVar120._24_4_ = auVar144._24_4_ + auVar111._24_4_;
      auVar120._28_4_ = auVar144._28_4_ + auVar111._28_4_;
      auVar111 = vsubps_avx(auVar146,auVar96);
      auVar152 = ZEXT3264(auVar111);
      auVar109._0_4_ = auVar146._0_4_ + auVar96._0_4_;
      auVar109._4_4_ = auVar146._4_4_ + auVar96._4_4_;
      auVar109._8_4_ = auVar146._8_4_ + auVar96._8_4_;
      auVar109._12_4_ = auVar146._12_4_ + auVar96._12_4_;
      auVar109._16_4_ = auVar146._16_4_ + auVar96._16_4_;
      auVar109._20_4_ = auVar146._20_4_ + auVar96._20_4_;
      auVar109._24_4_ = auVar146._24_4_ + auVar96._24_4_;
      auVar109._28_4_ = auVar146._28_4_ + auVar96._28_4_;
      auVar146 = vsubps_avx(auVar147,auVar106);
      auVar85._0_4_ = auVar147._0_4_ + auVar106._0_4_;
      auVar85._4_4_ = auVar147._4_4_ + auVar106._4_4_;
      auVar85._8_4_ = auVar147._8_4_ + auVar106._8_4_;
      auVar85._12_4_ = auVar147._12_4_ + auVar106._12_4_;
      auVar85._16_4_ = auVar147._16_4_ + auVar106._16_4_;
      auVar85._20_4_ = auVar147._20_4_ + auVar106._20_4_;
      auVar85._24_4_ = auVar147._24_4_ + auVar106._24_4_;
      auVar85._28_4_ = auVar147._28_4_ + auVar106._28_4_;
      auVar140._0_4_ = auVar146._0_4_ * auVar109._0_4_;
      auVar140._4_4_ = auVar146._4_4_ * auVar109._4_4_;
      auVar140._8_4_ = auVar146._8_4_ * auVar109._8_4_;
      auVar140._12_4_ = auVar146._12_4_ * auVar109._12_4_;
      auVar140._16_4_ = auVar146._16_4_ * auVar109._16_4_;
      auVar140._20_4_ = auVar146._20_4_ * auVar109._20_4_;
      auVar140._24_4_ = auVar146._24_4_ * auVar109._24_4_;
      auVar140._28_4_ = 0;
      auVar15 = vfmsub231ps_fma(auVar140,auVar111,auVar85);
      auVar47._4_4_ = auVar168._4_4_ * auVar85._4_4_;
      auVar47._0_4_ = auVar168._0_4_ * auVar85._0_4_;
      auVar47._8_4_ = auVar168._8_4_ * auVar85._8_4_;
      auVar47._12_4_ = auVar168._12_4_ * auVar85._12_4_;
      auVar47._16_4_ = auVar168._16_4_ * auVar85._16_4_;
      auVar47._20_4_ = auVar168._20_4_ * auVar85._20_4_;
      auVar47._24_4_ = auVar168._24_4_ * auVar85._24_4_;
      auVar47._28_4_ = auVar85._28_4_;
      auVar148 = vfmsub231ps_fma(auVar47,auVar146,auVar120);
      auVar48._4_4_ = auVar120._4_4_ * auVar111._4_4_;
      auVar48._0_4_ = auVar120._0_4_ * auVar111._0_4_;
      auVar48._8_4_ = auVar120._8_4_ * auVar111._8_4_;
      auVar48._12_4_ = auVar120._12_4_ * auVar111._12_4_;
      auVar48._16_4_ = auVar120._16_4_ * auVar111._16_4_;
      auVar48._20_4_ = auVar120._20_4_ * auVar111._20_4_;
      auVar48._24_4_ = auVar120._24_4_ * auVar111._24_4_;
      auVar48._28_4_ = auVar120._28_4_;
      auVar16 = vfmsub231ps_fma(auVar48,auVar168,auVar109);
      auVar49._4_4_ = fVar126 * auVar16._4_4_;
      auVar49._0_4_ = fVar116 * auVar16._0_4_;
      auVar49._8_4_ = fVar128 * auVar16._8_4_;
      auVar49._12_4_ = fVar130 * auVar16._12_4_;
      auVar49._16_4_ = fVar132 * 0.0;
      auVar49._20_4_ = fVar134 * 0.0;
      auVar49._24_4_ = fVar136 * 0.0;
      auVar49._28_4_ = auVar109._28_4_;
      auVar165 = ZEXT3264(local_5e80);
      auVar148 = vfmadd231ps_fma(auVar49,local_5e80,ZEXT1632(auVar148));
      auVar148 = vfmadd231ps_fma(ZEXT1632(auVar148),auVar110,ZEXT1632(auVar15));
      auVar88 = ZEXT1632(CONCAT412(auVar148._12_4_ + auVar95._12_4_ + auVar14._12_4_,
                                   CONCAT48(auVar148._8_4_ + auVar95._8_4_ + auVar14._8_4_,
                                            CONCAT44(auVar148._4_4_ + auVar95._4_4_ + auVar14._4_4_,
                                                     auVar148._0_4_ + auVar95._0_4_ + auVar14._0_4_)
                                           )));
      local_5de0 = ZEXT1632(auVar95);
      auVar96 = vminps_avx(local_5de0,ZEXT1632(auVar14));
      auVar96 = vminps_avx(auVar96,ZEXT1632(auVar148));
      local_5e00 = vandps_avx(auVar88,local_5cc0);
      fVar116 = local_5e00._0_4_ * 1.1920929e-07;
      fVar126 = local_5e00._4_4_ * 1.1920929e-07;
      auVar50._4_4_ = fVar126;
      auVar50._0_4_ = fVar116;
      fVar128 = local_5e00._8_4_ * 1.1920929e-07;
      auVar50._8_4_ = fVar128;
      fVar130 = local_5e00._12_4_ * 1.1920929e-07;
      auVar50._12_4_ = fVar130;
      fVar132 = local_5e00._16_4_ * 1.1920929e-07;
      auVar50._16_4_ = fVar132;
      fVar134 = local_5e00._20_4_ * 1.1920929e-07;
      auVar50._20_4_ = fVar134;
      fVar136 = local_5e00._24_4_ * 1.1920929e-07;
      auVar50._24_4_ = fVar136;
      auVar50._28_4_ = 0x34000000;
      auVar141._0_4_ = (uint)fVar116 ^ local_5e60._0_4_;
      auVar141._4_4_ = (uint)fVar126 ^ local_5e60._4_4_;
      auVar141._8_4_ = (uint)fVar128 ^ local_5e60._8_4_;
      auVar141._12_4_ = (uint)fVar130 ^ local_5e60._12_4_;
      auVar141._16_4_ = (uint)fVar132 ^ local_5e60._16_4_;
      auVar141._20_4_ = (uint)fVar134 ^ local_5e60._20_4_;
      auVar141._24_4_ = (uint)fVar136 ^ local_5e60._24_4_;
      auVar141._28_4_ = local_5e60._28_4_ ^ 0x34000000;
      auVar96 = vcmpps_avx(auVar96,auVar141,5);
      auVar103 = ZEXT1632(auVar14);
      auVar144 = vmaxps_avx(local_5de0,auVar103);
      auVar106 = vmaxps_avx(auVar144,ZEXT1632(auVar148));
      auVar106 = vcmpps_avx(auVar106,auVar50,2);
      auVar96 = vorps_avx(auVar96,auVar106);
      auVar147 = local_5f60._0_32_ & auVar96;
      bVar80 = true;
      if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar147 >> 0x7f,0) == '\0') &&
            (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar147 >> 0xbf,0) == '\0') &&
          (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar147[0x1f]) {
LAB_006099e6:
        auVar170 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
        auVar172 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                      CONCAT424(0x3f7ffffa,
                                                CONCAT420(0x3f7ffffa,
                                                          CONCAT416(0x3f7ffffa,
                                                                    CONCAT412(0x3f7ffffa,
                                                                              CONCAT48(0x3f7ffffa,
                                                                                                                                                                              
                                                  0x3f7ffffa3f7ffffa)))))));
      }
      else {
        auVar51._4_4_ = fVar94 * local_5d60._4_4_;
        auVar51._0_4_ = fVar81 * local_5d60._0_4_;
        auVar51._8_4_ = fVar8 * local_5d60._8_4_;
        auVar51._12_4_ = fVar10 * local_5d60._12_4_;
        auVar51._16_4_ = fVar91 * local_5d60._16_4_;
        auVar51._20_4_ = fVar11 * local_5d60._20_4_;
        auVar51._24_4_ = fVar13 * local_5d60._24_4_;
        auVar51._28_4_ = auVar96._28_4_;
        auVar52._4_4_ = fVar129 * local_5d80._4_4_;
        auVar52._0_4_ = fVar125 * local_5d80._0_4_;
        auVar52._8_4_ = fVar133 * local_5d80._8_4_;
        auVar52._12_4_ = fVar171 * local_5d80._12_4_;
        auVar52._16_4_ = fVar174 * local_5d80._16_4_;
        auVar52._20_4_ = fVar176 * local_5d80._20_4_;
        auVar52._24_4_ = fVar178 * local_5d80._24_4_;
        auVar52._28_4_ = auVar106._28_4_;
        auVar148 = vfmsub213ps_fma(local_5d80,auVar107,auVar51);
        auVar53._4_4_ = fVar92 * auVar111._4_4_;
        auVar53._0_4_ = fVar90 * auVar111._0_4_;
        auVar53._8_4_ = fVar7 * auVar111._8_4_;
        auVar53._12_4_ = fVar9 * auVar111._12_4_;
        auVar53._16_4_ = fVar89 * auVar111._16_4_;
        auVar53._20_4_ = fVar93 * auVar111._20_4_;
        auVar53._24_4_ = fVar12 * auVar111._24_4_;
        auVar53._28_4_ = 0x34000000;
        auVar54._4_4_ = fVar129 * auVar146._4_4_;
        auVar54._0_4_ = fVar125 * auVar146._0_4_;
        auVar54._8_4_ = fVar133 * auVar146._8_4_;
        auVar54._12_4_ = fVar171 * auVar146._12_4_;
        auVar54._16_4_ = fVar174 * auVar146._16_4_;
        auVar54._20_4_ = fVar176 * auVar146._20_4_;
        auVar54._24_4_ = fVar178 * auVar146._24_4_;
        auVar54._28_4_ = auVar144._28_4_;
        auVar15 = vfmsub213ps_fma(auVar146,local_5da0,auVar53);
        auVar106 = vandps_avx(auVar51,local_5cc0);
        auVar144 = vandps_avx(auVar53,local_5cc0);
        auVar106 = vcmpps_avx(auVar106,auVar144,1);
        auVar146 = vblendvps_avx(ZEXT1632(auVar15),ZEXT1632(auVar148),auVar106);
        auVar55._4_4_ = auVar168._4_4_ * fVar94;
        auVar55._0_4_ = auVar168._0_4_ * fVar81;
        auVar55._8_4_ = auVar168._8_4_ * fVar8;
        auVar55._12_4_ = auVar168._12_4_ * fVar10;
        auVar55._16_4_ = auVar168._16_4_ * fVar91;
        auVar55._20_4_ = auVar168._20_4_ * fVar11;
        auVar55._24_4_ = auVar168._24_4_ * fVar13;
        auVar55._28_4_ = auVar106._28_4_;
        auVar148 = vfmsub213ps_fma(auVar168,auVar107,auVar54);
        auVar160 = ZEXT1664(auVar148);
        auVar56._4_4_ = fVar92 * local_5d40._4_4_;
        auVar56._0_4_ = fVar90 * local_5d40._0_4_;
        auVar56._8_4_ = fVar7 * local_5d40._8_4_;
        auVar56._12_4_ = fVar9 * local_5d40._12_4_;
        auVar56._16_4_ = fVar89 * local_5d40._16_4_;
        auVar56._20_4_ = fVar93 * local_5d40._20_4_;
        auVar56._24_4_ = fVar12 * local_5d40._24_4_;
        auVar56._28_4_ = auVar144._28_4_;
        auVar15 = vfmsub213ps_fma(local_5d60,auVar163,auVar56);
        auVar106 = vandps_avx(auVar56,local_5cc0);
        auVar144 = vandps_avx(auVar54,local_5cc0);
        auVar106 = vcmpps_avx(auVar106,auVar144,1);
        auVar147 = vblendvps_avx(ZEXT1632(auVar148),ZEXT1632(auVar15),auVar106);
        auVar148 = vfmsub213ps_fma(local_5d40,local_5da0,auVar52);
        auVar15 = vfmsub213ps_fma(auVar111,auVar163,auVar55);
        auVar106 = vandps_avx(auVar52,local_5cc0);
        auVar144 = vandps_avx(auVar55,local_5cc0);
        auVar111 = vcmpps_avx(auVar106,auVar144,1);
        auVar144 = vblendvps_avx(ZEXT1632(auVar15),ZEXT1632(auVar148),auVar111);
        local_5fa0._0_4_ = auVar71._0_4_;
        local_5fa0._4_4_ = auVar71._4_4_;
        fStack_5f98 = auVar71._8_4_;
        fStack_5f94 = auVar71._12_4_;
        fStack_5f90 = auVar71._16_4_;
        fStack_5f8c = auVar71._20_4_;
        fStack_5f88 = auVar71._24_4_;
        auVar57._4_4_ = auVar144._4_4_ * (float)local_5fa0._4_4_;
        auVar57._0_4_ = auVar144._0_4_ * (float)local_5fa0._0_4_;
        auVar57._8_4_ = auVar144._8_4_ * fStack_5f98;
        auVar57._12_4_ = auVar144._12_4_ * fStack_5f94;
        auVar57._16_4_ = auVar144._16_4_ * fStack_5f90;
        auVar57._20_4_ = auVar144._20_4_ * fStack_5f8c;
        auVar57._24_4_ = auVar144._24_4_ * fStack_5f88;
        auVar57._28_4_ = auVar111._28_4_;
        auVar148 = vfmadd213ps_fma(local_5e80,auVar147,auVar57);
        auVar148 = vfmadd213ps_fma(auVar110,auVar146,ZEXT1632(auVar148));
        fVar81 = auVar148._0_4_ + auVar148._0_4_;
        fVar90 = auVar148._4_4_ + auVar148._4_4_;
        fVar92 = auVar148._8_4_ + auVar148._8_4_;
        fVar94 = auVar148._12_4_ + auVar148._12_4_;
        auVar111 = ZEXT1632(CONCAT412(fVar94,CONCAT48(fVar92,CONCAT44(fVar90,fVar81))));
        auVar58._4_4_ = auVar144._4_4_ * fVar127;
        auVar58._0_4_ = auVar144._0_4_ * fVar115;
        auVar58._8_4_ = auVar144._8_4_ * fVar131;
        auVar58._12_4_ = auVar144._12_4_ * fVar135;
        auVar58._16_4_ = auVar144._16_4_ * fVar173;
        auVar58._20_4_ = auVar144._20_4_ * fVar175;
        auVar58._24_4_ = auVar144._24_4_ * fVar177;
        auVar58._28_4_ = auVar106._28_4_;
        auVar148 = vfmadd213ps_fma(local_5d00,auVar147,auVar58);
        auVar15 = vfmadd213ps_fma(local_5ce0,auVar146,ZEXT1632(auVar148));
        auVar110 = vrcpps_avx(auVar111);
        auVar150._8_4_ = 0x3f800000;
        auVar150._0_8_ = 0x3f8000003f800000;
        auVar150._12_4_ = 0x3f800000;
        auVar150._16_4_ = 0x3f800000;
        auVar150._20_4_ = 0x3f800000;
        auVar150._24_4_ = 0x3f800000;
        auVar150._28_4_ = 0x3f800000;
        auVar152 = ZEXT3264(auVar150);
        auVar148 = vfnmadd213ps_fma(auVar110,auVar111,auVar150);
        auVar148 = vfmadd132ps_fma(ZEXT1632(auVar148),auVar110,auVar110);
        auVar107 = ZEXT1632(CONCAT412((auVar15._12_4_ + auVar15._12_4_) * auVar148._12_4_,
                                      CONCAT48((auVar15._8_4_ + auVar15._8_4_) * auVar148._8_4_,
                                               CONCAT44((auVar15._4_4_ + auVar15._4_4_) *
                                                        auVar148._4_4_,
                                                        (auVar15._0_4_ + auVar15._0_4_) *
                                                        auVar148._0_4_))));
        _local_5fa0 = *(undefined1 (*) [32])(ray + 0x100);
        auVar165 = ZEXT3264(_local_5fa0);
        auVar110 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar107,2);
        auVar106 = vcmpps_avx(auVar107,_local_5fa0,2);
        auVar110 = vandps_avx(auVar110,auVar106);
        auVar121._0_4_ = (uint)fVar81 ^ local_5e60._0_4_;
        auVar121._4_4_ = (uint)fVar90 ^ local_5e60._4_4_;
        auVar121._8_4_ = (uint)fVar92 ^ local_5e60._8_4_;
        auVar121._12_4_ = (uint)fVar94 ^ local_5e60._12_4_;
        auVar121._16_4_ = local_5e60._16_4_;
        auVar121._20_4_ = local_5e60._20_4_;
        auVar121._24_4_ = local_5e60._24_4_;
        auVar121._28_4_ = local_5e60._28_4_;
        auVar106 = vcmpps_avx(auVar111,auVar121,4);
        auVar110 = vandps_avx(auVar106,auVar110);
        auVar106 = vandps_avx(auVar96,local_5f60._0_32_);
        auVar110 = vpslld_avx2(auVar110,0x1f);
        auVar111 = vpsrad_avx2(auVar110,0x1f);
        auVar110 = auVar106 & auVar111;
        local_5e40 = auVar88;
        local_5e20 = auVar103;
        local_5dc0 = auVar96;
        if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar110 >> 0x7f,0) == '\0') &&
              (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar110 >> 0xbf,0) == '\0') &&
            (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar110[0x1f]) goto LAB_006099e6;
        auVar110 = vandps_avx(auVar111,auVar106);
        uVar1 = *(uint *)(lVar73 + -0x10 + uVar79 * 4);
        pGVar4 = (context->scene->geometries).items[uVar1].ptr;
        uVar2 = pGVar4->mask;
        auVar112._4_4_ = uVar2;
        auVar112._0_4_ = uVar2;
        auVar112._8_4_ = uVar2;
        auVar112._12_4_ = uVar2;
        auVar112._16_4_ = uVar2;
        auVar112._20_4_ = uVar2;
        auVar112._24_4_ = uVar2;
        auVar112._28_4_ = uVar2;
        auVar96 = vpand_avx2(auVar112,*(undefined1 (*) [32])(ray + 0x120));
        auVar106 = vpcmpeqd_avx2(auVar96,_DAT_01faff00);
        auVar96 = auVar110 & ~auVar106;
        auVar170 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
        auVar172 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                      CONCAT424(0x3f7ffffa,
                                                CONCAT420(0x3f7ffffa,
                                                          CONCAT416(0x3f7ffffa,
                                                                    CONCAT412(0x3f7ffffa,
                                                                              CONCAT48(0x3f7ffffa,
                                                                                                                                                                              
                                                  0x3f7ffffa3f7ffffa)))))));
        if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar96 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar96 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar96 >> 0x7f,0) != '\0') ||
              (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar96 >> 0xbf,0) != '\0') ||
            (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar96[0x1f] < '\0') {
          uVar78 = *(undefined4 *)(lVar73 + uVar79 * 4);
          auVar110 = vandnps_avx(auVar106,auVar110);
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar96 = vrcpps_avx(auVar88);
            auVar151._8_4_ = 0x3f800000;
            auVar151._0_8_ = 0x3f8000003f800000;
            auVar151._12_4_ = 0x3f800000;
            auVar151._16_4_ = 0x3f800000;
            auVar151._20_4_ = 0x3f800000;
            auVar151._24_4_ = 0x3f800000;
            auVar151._28_4_ = 0x3f800000;
            auVar148 = vfnmadd213ps_fma(auVar88,auVar96,auVar151);
            auVar148 = vfmadd132ps_fma(ZEXT1632(auVar148),auVar96,auVar96);
            auVar87._8_4_ = 0x219392ef;
            auVar87._0_8_ = 0x219392ef219392ef;
            auVar87._12_4_ = 0x219392ef;
            auVar87._16_4_ = 0x219392ef;
            auVar87._20_4_ = 0x219392ef;
            auVar87._24_4_ = 0x219392ef;
            auVar87._28_4_ = 0x219392ef;
            auVar96 = vcmpps_avx(local_5e00,auVar87,5);
            auVar96 = vandps_avx(auVar96,ZEXT1632(auVar148));
            auVar61._4_4_ = auVar96._4_4_ * auVar95._4_4_;
            auVar61._0_4_ = auVar96._0_4_ * auVar95._0_4_;
            auVar61._8_4_ = auVar96._8_4_ * auVar95._8_4_;
            auVar61._12_4_ = auVar96._12_4_ * auVar95._12_4_;
            auVar61._16_4_ = auVar96._16_4_ * 0.0;
            auVar61._20_4_ = auVar96._20_4_ * 0.0;
            auVar61._24_4_ = auVar96._24_4_ * 0.0;
            auVar61._28_4_ = local_5e00._28_4_;
            auVar106 = vminps_avx(auVar61,auVar151);
            auVar62._4_4_ = auVar96._4_4_ * auVar14._4_4_;
            auVar62._0_4_ = auVar96._0_4_ * auVar14._0_4_;
            auVar62._8_4_ = auVar96._8_4_ * auVar14._8_4_;
            auVar62._12_4_ = auVar96._12_4_ * auVar14._12_4_;
            auVar62._16_4_ = auVar96._16_4_ * 0.0;
            auVar62._20_4_ = auVar96._20_4_ * 0.0;
            auVar62._24_4_ = auVar96._24_4_ * 0.0;
            auVar62._28_4_ = auVar96._28_4_;
            auVar96 = vminps_avx(auVar62,auVar151);
            auVar111 = vsubps_avx(auVar151,auVar106);
            auVar163 = vsubps_avx(auVar151,auVar96);
            auVar14._8_8_ = uStack_5998;
            auVar14._0_8_ = local_59a0;
            auVar66._16_8_ = uStack_5990;
            auVar66._0_16_ = auVar14;
            auVar66._24_8_ = uStack_5988;
            auVar160 = ZEXT3264(auVar66);
            local_5c40 = vblendvps_avx(auVar106,auVar111,auVar66);
            local_5c20 = vblendvps_avx(auVar96,auVar163,auVar66);
            pRVar5 = context->user;
            auVar148._4_4_ = uVar78;
            auVar148._0_4_ = uVar78;
            auVar148._8_4_ = uVar78;
            auVar148._12_4_ = uVar78;
            local_5c00._16_4_ = uVar78;
            local_5c00._0_16_ = auVar148;
            local_5c00._20_4_ = uVar78;
            local_5c00._24_4_ = uVar78;
            local_5c00._28_4_ = uVar78;
            auVar152 = ZEXT3264(local_5c00);
            auVar106 = vpcmpeqd_avx2(local_5c40,local_5c40);
            local_5f38[1] = auVar106;
            *local_5f38 = auVar106;
            local_5bc0 = pRVar5->instID[0];
            local_5ba0 = pRVar5->instPrimID[0];
            auVar96 = vblendvps_avx(_local_5fa0,auVar107,auVar110);
            *(undefined1 (*) [32])(ray + 0x100) = auVar96;
            local_5f30.valid = (int *)local_5f00;
            local_5f30.geometryUserPtr = pGVar4->userPtr;
            local_5f30.context = context->user;
            local_5f30.hit = local_5ca0;
            local_5f30.N = 8;
            local_5f30.ray = (RTCRayN *)ray;
            local_5f00 = auVar110;
            local_5ca0 = (RTCHitN  [32])auVar146;
            local_5c80 = auVar147;
            local_5c60 = auVar144;
            local_5be0 = uVar1;
            uStack_5bdc = uVar1;
            uStack_5bd8 = uVar1;
            uStack_5bd4 = uVar1;
            uStack_5bd0 = uVar1;
            uStack_5bcc = uVar1;
            uStack_5bc8 = uVar1;
            uStack_5bc4 = uVar1;
            uStack_5bbc = local_5bc0;
            uStack_5bb8 = local_5bc0;
            uStack_5bb4 = local_5bc0;
            uStack_5bb0 = local_5bc0;
            uStack_5bac = local_5bc0;
            uStack_5ba8 = local_5bc0;
            uStack_5ba4 = local_5bc0;
            uStack_5b9c = local_5ba0;
            uStack_5b98 = local_5ba0;
            uStack_5b94 = local_5ba0;
            uStack_5b90 = local_5ba0;
            uStack_5b8c = local_5ba0;
            uStack_5b88 = local_5ba0;
            uStack_5b84 = local_5ba0;
            if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              auVar152 = ZEXT1664(auVar148);
              auVar160 = ZEXT1664(auVar14);
              (*pGVar4->occlusionFilterN)(&local_5f30);
              auVar170._8_56_ = extraout_var;
              auVar170._0_8_ = extraout_XMM1_Qa;
              auVar165 = ZEXT3264(_local_5fa0);
              auVar106 = vpcmpeqd_avx2(auVar170._0_32_,auVar170._0_32_);
              auVar172 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                            CONCAT424(0x3f7ffffa,
                                                      CONCAT420(0x3f7ffffa,
                                                                CONCAT416(0x3f7ffffa,
                                                                          CONCAT412(0x3f7ffffa,
                                                                                    CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
              auVar170 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              uVar76 = local_5fb8;
              ray = local_5fb0;
              context = local_5fa8;
            }
            auVar110 = vpcmpeqd_avx2(local_5f00,_DAT_01faff00);
            auVar96 = auVar106 & ~auVar110;
            if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar96 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar96 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar96 >> 0x7f,0) == '\0') &&
                  (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar96 >> 0xbf,0) == '\0') &&
                (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar96[0x1f]) {
              auVar110 = auVar110 ^ auVar106;
            }
            else {
              p_Var6 = context->args->filter;
              if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                _local_5fa0 = auVar165._0_32_;
                auVar152 = ZEXT1664(auVar152._0_16_);
                auVar160 = ZEXT1664(auVar160._0_16_);
                (*p_Var6)(&local_5f30);
                auVar165 = ZEXT3264(_local_5fa0);
                auVar172 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                              CONCAT424(0x3f7ffffa,
                                                        CONCAT420(0x3f7ffffa,
                                                                  CONCAT416(0x3f7ffffa,
                                                                            CONCAT412(0x3f7ffffa,
                                                                                      CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                auVar170 = ZEXT3264(CONCAT428(0x7f800000,
                                              CONCAT424(0x7f800000,
                                                        CONCAT420(0x7f800000,
                                                                  CONCAT416(0x7f800000,
                                                                            CONCAT412(0x7f800000,
                                                                                      CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                uVar76 = local_5fb8;
                ray = local_5fb0;
                context = local_5fa8;
              }
              auVar96 = vpcmpeqd_avx2(local_5f00,_DAT_01faff00);
              auVar110 = auVar96 ^ _DAT_01fe9960;
              auVar113._8_4_ = 0xff800000;
              auVar113._0_8_ = 0xff800000ff800000;
              auVar113._12_4_ = 0xff800000;
              auVar113._16_4_ = 0xff800000;
              auVar113._20_4_ = 0xff800000;
              auVar113._24_4_ = 0xff800000;
              auVar113._28_4_ = 0xff800000;
              auVar96 = vblendvps_avx(auVar113,*(undefined1 (*) [32])(local_5f30.ray + 0x100),
                                      auVar96);
              *(undefined1 (*) [32])(local_5f30.ray + 0x100) = auVar96;
            }
            auVar96 = vblendvps_avx(auVar165._0_32_,*(undefined1 (*) [32])local_5f68,auVar110);
            *(undefined1 (*) [32])local_5f68 = auVar96;
          }
          auVar96 = local_5f60._0_32_ & ~auVar110;
          local_5f60._0_32_ = vandnps_avx(auVar110,local_5f60._0_32_);
          bVar80 = (((((((auVar96 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar96 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar96 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar96 >> 0x7f,0) != '\0') ||
                     (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar96 >> 0xbf,0) != '\0') ||
                   (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar96[0x1f] < '\0';
        }
      }
      if ((!bVar80) || (unaff_R15 = uVar79 + 1, bVar80 = 2 < uVar79, uVar79 = unaff_R15, bVar80))
      break;
    }
    auVar103 = vandps_avx(local_5f60._0_32_,local_5ec0);
    auVar110 = local_5ec0 & local_5f60._0_32_;
    if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar110 >> 0x7f,0) == '\0') &&
          (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar110 >> 0xbf,0) == '\0') &&
        (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar110[0x1f])
    break;
  }
  auVar110 = vpcmpeqd_avx2(local_5f60._0_32_,local_5f60._0_32_);
  auVar88._0_4_ = auVar103._0_4_ ^ auVar110._0_4_;
  auVar88._4_4_ = auVar103._4_4_ ^ auVar110._4_4_;
  auVar88._8_4_ = auVar103._8_4_ ^ auVar110._8_4_;
  auVar88._12_4_ = auVar103._12_4_ ^ auVar110._12_4_;
  auVar88._16_4_ = auVar103._16_4_ ^ auVar110._16_4_;
  auVar88._20_4_ = auVar103._20_4_ ^ auVar110._20_4_;
  auVar88._24_4_ = auVar103._24_4_ ^ auVar110._24_4_;
  auVar88._28_4_ = auVar103._28_4_ ^ auVar110._28_4_;
LAB_00609df5:
  local_5ea0 = vorps_avx(local_5ea0,auVar88);
  auVar110 = auVar110 & ~local_5ea0;
  if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar110 >> 0x7f,0) == '\0') &&
        (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar110 >> 0xbf,0) == '\0') &&
      (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar110[0x1f])
  goto LAB_00609f1c;
  auVar123._8_4_ = 0xff800000;
  auVar123._0_8_ = 0xff800000ff800000;
  auVar123._12_4_ = 0xff800000;
  auVar123._16_4_ = 0xff800000;
  auVar123._20_4_ = 0xff800000;
  auVar123._24_4_ = 0xff800000;
  auVar123._28_4_ = 0xff800000;
  auVar124 = ZEXT3264(auVar123);
  local_59e0 = vblendvps_avx(local_59e0,auVar123,local_5ea0);
  goto LAB_00608c3e;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }